

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txpackage_tests.cpp
# Opt level: O3

void __thiscall txpackage_tests::package_hash_tests::test_method(package_hash_tests *this)

{
  undefined1 *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint uVar5;
  int iVar6;
  CTransaction *__args;
  char *pcVar8;
  undefined8 uVar9;
  iterator in_R8;
  iterator pvVar10;
  iterator in_R9;
  iterator pvVar11;
  long lVar12;
  long in_FS_OFFSET;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  Span<const_std::byte> sp;
  Span<const_std::byte> sp_00;
  Span<const_std::byte> sp_01;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_00;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_01;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_02;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_03;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_04;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  check_type cVar49;
  undefined1 *local_970;
  undefined1 *local_968;
  char *local_960;
  char *local_958;
  undefined1 *local_950;
  undefined1 *local_948;
  char *local_940;
  char *local_938;
  undefined1 *local_930;
  undefined1 *local_928;
  char *local_920;
  char *local_918;
  undefined1 *local_910;
  undefined1 *local_908;
  char *local_900;
  char *local_8f8;
  undefined1 *local_8f0;
  undefined1 *local_8e8;
  char *local_8e0;
  char *local_8d8;
  undefined1 local_8d0 [16];
  undefined1 *local_8c0;
  char *local_8b8;
  undefined1 *local_8b0;
  undefined1 *local_8a8;
  char *local_8a0;
  char *local_898;
  char *local_890;
  char *local_888;
  undefined1 *local_880;
  undefined1 *local_878;
  char *local_870;
  char *local_868;
  char *local_860;
  char *local_858;
  undefined1 *local_850;
  undefined1 *local_848;
  char *local_840;
  char *local_838;
  char *local_830;
  char *local_828;
  undefined1 *local_820;
  undefined1 *local_818;
  char *local_810;
  char *local_808;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  package_321;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  package_312;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  package_213;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  package_231;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  package_132;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  package_123;
  char *local_770;
  char *local_768;
  undefined1 *local_760;
  undefined1 *local_758;
  char *local_750;
  char *local_748;
  char *local_740;
  char *local_738;
  undefined1 *local_730;
  undefined1 *local_728;
  char *local_720;
  char *local_718;
  char *local_710;
  char *local_708;
  undefined1 *local_700;
  undefined1 *local_6f8;
  char *local_6f0;
  char *local_6e8;
  char *local_6e0;
  char *local_6d8;
  undefined1 *local_6d0;
  undefined1 *local_6c8;
  char *local_6c0;
  char *local_6b8;
  char *local_6b0;
  char *local_6a8;
  undefined1 *local_6a0;
  undefined1 *local_698;
  char *local_690;
  char *local_688;
  char *local_680;
  char *local_678;
  undefined1 *local_670;
  undefined1 *local_668;
  char *local_660;
  char *local_658;
  undefined1 *local_650;
  undefined1 *local_648;
  char *local_640;
  char *local_638;
  undefined1 *local_630;
  undefined1 *local_628;
  char *local_620;
  char *local_618;
  undefined1 *local_610;
  undefined1 *local_608;
  char *local_600;
  char *local_5f8;
  char *local_5f0;
  char *local_5e8;
  undefined1 *local_5e0;
  undefined1 *local_5d8;
  char *local_5d0;
  char *local_5c8;
  char *local_5c0;
  char *local_5b8;
  undefined1 *local_5b0;
  undefined1 *local_5a8;
  char *local_5a0;
  char *local_598;
  undefined1 *local_590;
  undefined1 *local_588;
  char *local_580;
  char *local_578;
  undefined1 *local_570;
  undefined1 *local_568;
  char *local_560;
  char *local_558;
  undefined1 *local_550;
  undefined1 *local_548;
  char *local_540;
  char *local_538;
  CTransactionRef ptx_3;
  DataStream stream_3;
  CTransactionRef ptx_2;
  DataStream stream_2;
  CTransactionRef ptx_1;
  DataStream stream_1;
  undefined1 local_4a0 [8];
  uint256 *local_498;
  char *local_490;
  char *local_488;
  assertion_result local_480;
  uint256 local_468;
  uint256 hash_if_use_int_order;
  uint256 hash_if_use_txid;
  uint256 hash_if_by_txid;
  optional<uint256> u;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_3c0;
  uint256 calculated_hash_123;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  assertion_result local_338;
  undefined8 uStack_320;
  lazy_ostream local_318;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  CTransaction tx_3;
  CTransaction tx_2;
  CTransaction tx_1;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_48;
  long local_38;
  ulong uVar7;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(&tx_3,
         _ZTAXtlN4util12hex_literals6detail3HexILm447EEEtlSt5arrayISt4byteLm223EEtlA223_S5_LS5_2ELS5_0ELS5_0ELS5_0ELS5_0ELS5_1ELS5_1ELS5_150ELS5_75ELS5_138ELS5_166ELS5_53ELS5_9ELS5_87ELS5_156ELS5_166ELS5_8ELS5_110ELS5_96ELS5_18ELS5_238ELS5_170ELS5_76ELS5_47ELS5_77ELS5_209ELS5_226ELS5_131ELS5_218ELS5_41ELS5_182ELS5_124ELS5_142ELS5_234ELS5_56ELS5_179ELS5_198ELS5_253ELS5_34ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_253ELS5_255ELS5_255ELS5_255ELS5_2ELS5_148ELS5_198ELS5_24ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_23ELS5_169ELS5_20ELS5_90ELS5_251ELS5_187ELS5_66ELS5_244ELS5_232ELS5_51ELS5_18ELS5_102ELS5_109ELS5_6ELS5_151ELS5_249ELS5_230ELS5_98ELS5_89ELS5_145ELS5_46ELS5_205ELS5_227ELS5_135ELS5_104ELS5_250ELS5_44ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_22ELS5_0ELS5_20ELS5_137ELS5_115ELS5_136ELS5_160ELS5_136ELS5_147ELS5_144ELS5_253ELS5_14ELS5_21ELS5_58ELS5_34ELS5_187ELS5_44ELS5_249ELS5_216ELS5_240ELS5_25ELS5_250ELS5_245ELS5_2ELS5_71ELS5_48ELS5_68ELS5_2ELS5_32ELS5_5ELS5_71ELS5_64ELS5_99ELS5_128ELS5_113ELS5_159ELS5_132ELS5_214ELS5_140ELS5_244ELS5_233ELS5_108ELS5_195ELS5_228ELS5_161ELS5_104ELS5_131ELS5_9ELS5_239ELS5_71ELS5_91ELS5_21ELS5_11ELS5_226ELS5_180ELS5_113ELS5_199ELS5_14ELS5_165ELS5_98ELS5_170ELS5_2ELS5_32ELS5_109ELS5_37ELS5_95ELS5_90ELS5_204ELS5_64ELS5_253ELS5_149ELS5_152ELS5_24ELS5_116ELS5_215ELS5_114ELS5_1ELS5_210ELS5_235ELS5_7ELS5_136ELS5_54ELS5_87ELS5_206ELS5_28ELS5_121ELS5_101ELS5_19ELS5_243ELS5_43ELS5_96ELS5_121ELS5_84ELS5_92ELS5_223ELS5_1ELS5_33ELS5_2ELS5_58ELS5_231ELS5_115ELS5_53ELS5_206ELS5_252ELS5_181ELS5_171ELS5_76ELS5_29ELS5_193ELS5_251ELS5_13ELS5_42ELS5_207ELS5_236ELS5_225ELS5_132ELS5_229ELS5_147ELS5_114ELS5_125ELS5_125ELS5_89ELS5_6ELS5_199ELS5_142ELS5_86ELS5_76ELS5_124ELS5_17ELS5_209ELS5_37ELS5_207ELS5_12EEEEE
         ,0xdf);
  sp.m_size = 0xdf;
  sp.m_data = (byte *)&tx_3;
  DataStream::DataStream(&stream_1,sp);
  CTransaction::CTransaction<DataStream>(&tx_1,&::TX_WITH_WITNESS,&stream_1);
  ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CTransaction&>
            (&ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (CTransaction **)&ptx_1,(allocator<CTransaction> *)&tx_3,&tx_1);
  memcpy(&tx_3,
         _ZTAXtlN4util12hex_literals6detail3HexILm517EEEtlSt5arrayISt4byteLm258EEtlA258_S5_LS5_1ELS5_0ELS5_0ELS5_0ELS5_1ELS5_11ELS5_38ELS5_233ELS5_183ELS5_115ELS5_94ELS5_182ELS5_170ELS5_189ELS5_243ELS5_88ELS5_186ELS5_182ELS5_47ELS5_152ELS5_22ELS5_162ELS5_27ELS5_169ELS5_235ELS5_219ELS5_113ELS5_157ELS5_82ELS5_153ELS5_232ELS5_134ELS5_7ELS5_215ELS5_34ELS5_193ELS5_144ELS5_0ELS5_0ELS5_0ELS5_0ELS5_139ELS5_72ELS5_48ELS5_69ELS5_2ELS5_32ELS5_7ELS5_10ELS5_202ELS5_68ELS5_80ELS5_108ELS5_92ELS5_239ELS5_58ELS5_22ELS5_237ELS5_81ELS5_157ELS5_124ELS5_60ELS5_57ELS5_248ELS5_170ELS5_177ELS5_146ELS5_196ELS5_225ELS5_201ELS5_13ELS5_6ELS5_95ELS5_55ELS5_184ELS5_164ELS5_175ELS5_97ELS5_65ELS5_2ELS5_33ELS5_0ELS5_168ELS5_225ELS5_96ELS5_184ELS5_86ELS5_194ELS5_212ELS5_61ELS5_39ELS5_216ELS5_251ELS5_167ELS5_30ELS5_90ELS5_239ELS5_100ELS5_5ELS5_184ELS5_100ELS5_58ELS5_196ELS5_203ELS5_124ELS5_179ELS5_196ELS5_98ELS5_172ELS5_237ELS5_127ELS5_20ELS5_113ELS5_26ELS5_1ELS5_65ELS5_4ELS5_109ELS5_17ELS5_254ELS5_229ELS5_27ELS5_14ELS5_96ELS5_102ELS5_109ELS5_80ELS5_73ELS5_169ELS5_16ELS5_26ELS5_114ELS5_116ELS5_29ELS5_244ELS5_128ELS5_185ELS5_110ELS5_226ELS5_100ELS5_136ELS5_164ELS5_211ELS5_70ELS5_107ELS5_149ELS5_201ELS5_164ELS5_10ELS5_197ELS5_238ELS5_239ELS5_135ELS5_225ELS5_10ELS5_92ELS5_211ELS5_54ELS5_193ELS5_154ELS5_132ELS5_86ELS5_95ELS5_128ELS5_250ELS5_108ELS5_84ELS5_121ELS5_87ELS5_183ELS5_112ELS5_15ELS5_244ELS5_223ELS5_189ELS5_239ELS5_231ELS5_96ELS5_54ELS5_195ELS5_57ELS5_255ELS5_255ELS5_255ELS5_255ELS5_2ELS5_27ELS5_255ELS5_61ELS5_17ELS5_0ELS5_0ELS5_0ELS5_0ELS5_25ELS5_118ELS5_169ELS5_20ELS5_4ELS5_148ELS5_63ELS5_221ELS5_80ELS5_128ELS5_83ELS5_199ELS5_80ELS5_0ELS5_16ELS5_109ELS5_59ELS5_198ELS5_226ELS5_117ELS5_77ELS5_188ELS5_255ELS5_25ELS5_136ELS5_172ELS5_47ELS5_21ELS5_222ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_25ELS5_118ELS5_169ELS5_20ELS5_162ELS5_102ELS5_67ELS5_109ELS5_41ELS5_101ELS5_84ELS5_118ELS5_8ELS5_185ELS5_225ELS5_93ELS5_144ELS5_50ELS5_167ELS5_185ELS5_214ELS5_79ELS5_164ELS5_49ELS5_136ELS5_172EEEEE
         ,0x102);
  sp_00.m_size = 0x102;
  sp_00.m_data = (byte *)&tx_3;
  DataStream::DataStream(&stream_2,sp_00);
  CTransaction::CTransaction<DataStream>(&tx_2,&::TX_WITH_WITNESS,&stream_2);
  ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CTransaction&>
            (&ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (CTransaction **)&ptx_2,(allocator<CTransaction> *)&tx_3,&tx_2);
  memcpy(&tx_3,&DAT_00f46300,0x140);
  sp_01.m_size = 0x140;
  sp_01.m_data = (byte *)&tx_3;
  DataStream::DataStream(&stream_3,sp_01);
  CTransaction::CTransaction<DataStream>(&tx_3,&::TX_WITH_WITNESS,&stream_3);
  ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  __args = &tx_3;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CTransaction&>
            (&ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (CTransaction **)&ptx_3,(allocator<CTransaction> *)&u,__args);
  str._M_str = (char *)__args;
  str._M_len = (size_t)"85cd1a31eb38f74ed5742ec9cb546712ab5aaf747de28a9168b53e846cbda17f";
  detail::FromHex<uint256>(&u,(detail *)0x40,str);
  if (u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
      _M_engaged == false) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      std::__throw_bad_optional_access();
    }
    goto LAB_0067f8a0;
  }
  local_2a8 = u.super__Optional_base<uint256,_true,_true>._M_payload.
              super__Optional_payload_base<uint256>._M_payload._16_8_;
  uStack_2a0 = u.super__Optional_base<uint256,_true,_true>._M_payload.
               super__Optional_payload_base<uint256>._M_payload._24_8_;
  local_2b8 = u.super__Optional_base<uint256,_true,_true>._M_payload.
              super__Optional_payload_base<uint256>._M_payload._0_8_;
  uStack_2b0 = u.super__Optional_base<uint256,_true,_true>._M_payload.
               super__Optional_payload_base<uint256>._M_payload._8_8_;
  str_00._M_str = (char *)__args;
  str_00._M_len = (size_t)"b4749f017444b051c44dfd2720e88f314ff94f3dd6d56d40ef65854fcd7fff6b";
  detail::FromHex<uint256>(&u,(detail *)0x40,str_00);
  if (u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
      _M_engaged == false) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      std::__throw_bad_optional_access();
    }
    goto LAB_0067f8a0;
  }
  local_2c8 = u.super__Optional_base<uint256,_true,_true>._M_payload.
              super__Optional_payload_base<uint256>._M_payload._16_8_;
  uStack_2c0 = u.super__Optional_base<uint256,_true,_true>._M_payload.
               super__Optional_payload_base<uint256>._M_payload._24_8_;
  local_2d8 = u.super__Optional_base<uint256,_true,_true>._M_payload.
              super__Optional_payload_base<uint256>._M_payload._0_8_;
  uStack_2d0 = u.super__Optional_base<uint256,_true,_true>._M_payload.
               super__Optional_payload_base<uint256>._M_payload._8_8_;
  str_01._M_str = (char *)__args;
  str_01._M_len = (size_t)"e065bac15f62bb4e761d761db928ddee65a47296b2b776785abb912cdec474e3";
  detail::FromHex<uint256>(&u,(detail *)0x40,str_01);
  if (u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
      _M_engaged == false) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      std::__throw_bad_optional_access();
    }
    goto LAB_0067f8a0;
  }
  local_2e8 = u.super__Optional_base<uint256,_true,_true>._M_payload.
              super__Optional_payload_base<uint256>._M_payload._16_8_;
  uStack_2e0 = u.super__Optional_base<uint256,_true,_true>._M_payload.
               super__Optional_payload_base<uint256>._M_payload._24_8_;
  local_2f8 = u.super__Optional_base<uint256,_true,_true>._M_payload.
              super__Optional_payload_base<uint256>._M_payload._0_8_;
  uStack_2f0 = u.super__Optional_base<uint256,_true,_true>._M_payload.
               super__Optional_payload_base<uint256>._M_payload._8_8_;
  local_540 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_538 = "";
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  local_548 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x4f;
  file.m_begin = (iterator)&local_540;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_550,msg);
  local_318._8_8_ = local_318._8_8_ & 0xffffffffffffff00;
  local_318._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_308 = boost::unit_test::lazy_ostream::inst;
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems._0_8_ = &tx_1.m_witness_hash;
  auVar31[0] = -(tx_1.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] ==
                (uchar)local_2a8);
  auVar31[1] = -(tx_1.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] ==
                local_2a8._1_1_);
  auVar31[2] = -(tx_1.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] ==
                local_2a8._2_1_);
  auVar31[3] = -(tx_1.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] ==
                local_2a8._3_1_);
  auVar31[4] = -(tx_1.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] ==
                local_2a8._4_1_);
  auVar31[5] = -(tx_1.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] ==
                local_2a8._5_1_);
  auVar31[6] = -(tx_1.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] ==
                local_2a8._6_1_);
  auVar31[7] = -(tx_1.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] ==
                local_2a8._7_1_);
  auVar31[8] = -(tx_1.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] ==
                (uchar)uStack_2a0);
  auVar31[9] = -(tx_1.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] ==
                uStack_2a0._1_1_);
  auVar31[10] = -(tx_1.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                 uStack_2a0._2_1_);
  auVar31[0xb] = -(tx_1.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                  uStack_2a0._3_1_);
  auVar31[0xc] = -(tx_1.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                  uStack_2a0._4_1_);
  auVar31[0xd] = -(tx_1.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                  uStack_2a0._5_1_);
  auVar31[0xe] = -(tx_1.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                  uStack_2a0._6_1_);
  auVar31[0xf] = -(tx_1.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                  uStack_2a0._7_1_);
  auVar13[0] = -(tx_1.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] ==
                (uchar)local_2b8);
  auVar13[1] = -(tx_1.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] ==
                local_2b8._1_1_);
  auVar13[2] = -(tx_1.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] ==
                local_2b8._2_1_);
  auVar13[3] = -(tx_1.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] ==
                local_2b8._3_1_);
  auVar13[4] = -(tx_1.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] ==
                local_2b8._4_1_);
  auVar13[5] = -(tx_1.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] ==
                local_2b8._5_1_);
  auVar13[6] = -(tx_1.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] ==
                local_2b8._6_1_);
  auVar13[7] = -(tx_1.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] ==
                local_2b8._7_1_);
  auVar13[8] = -(tx_1.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] ==
                (uchar)uStack_2b0);
  auVar13[9] = -(tx_1.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] ==
                uStack_2b0._1_1_);
  auVar13[10] = -(tx_1.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] ==
                 uStack_2b0._2_1_);
  auVar13[0xb] = -(tx_1.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] ==
                  uStack_2b0._3_1_);
  auVar13[0xc] = -(tx_1.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] ==
                  uStack_2b0._4_1_);
  auVar13[0xd] = -(tx_1.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] ==
                  uStack_2b0._5_1_);
  auVar13[0xe] = -(tx_1.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] ==
                  uStack_2b0._6_1_);
  auVar13[0xf] = -(tx_1.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] ==
                  uStack_2b0._7_1_);
  auVar13 = auVar13 & auVar31;
  uStack_300 = "";
  local_338.m_message.px = (element_type *)0x0;
  local_338.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  uStack_350 = "";
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._M_value.super_base_blob<256U>.m_data._M_elems[8] = 0;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._0_8_ = &PTR__lazy_ostream_0138e0a0;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._24_8_ = &calculated_hash_123;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0] = (uchar)&local_2b8;
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[1] = (uchar)((ulong)&local_2b8 >> 8);
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[2] = (uchar)((ulong)&local_2b8 >> 0x10);
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[3] = (uchar)((ulong)&local_2b8 >> 0x18);
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[4] = (uchar)((ulong)&local_2b8 >> 0x20);
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[5] = (uchar)((ulong)&local_2b8 >> 0x28);
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[6] = (uchar)((ulong)&local_2b8 >> 0x30);
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[7] = (uchar)((ulong)&local_2b8 >> 0x38);
  local_58._8_8_ = local_58._9_8_ << 8;
  local_58._0_8_ = &PTR__lazy_ostream_0138e0a0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  aStack_48._8_8_ = &hash_if_by_txid;
  local_338.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) == 0xffff);
  boost::test_tools::tt_detail::report_assertion
            (&local_338,&local_318,1,2,REQUIRE,0xf43976,(size_t)&local_358,0x4f,&u,"wtxid_1",
             local_58);
  boost::detail::shared_count::~shared_count(&local_338.m_message.pn);
  local_560 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_558 = "";
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  local_568 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = &DAT_00000050;
  file_00.m_begin = (iterator)&local_560;
  msg_00.m_end = pvVar11;
  msg_00.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_570,
             msg_00);
  local_318._8_8_ = local_318._8_8_ & 0xffffffffffffff00;
  local_318._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems._0_8_ = &tx_2.m_witness_hash;
  auVar32[0] = -(tx_2.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] ==
                (uchar)local_2c8);
  auVar32[1] = -(tx_2.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] ==
                local_2c8._1_1_);
  auVar32[2] = -(tx_2.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] ==
                local_2c8._2_1_);
  auVar32[3] = -(tx_2.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] ==
                local_2c8._3_1_);
  auVar32[4] = -(tx_2.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] ==
                local_2c8._4_1_);
  auVar32[5] = -(tx_2.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] ==
                local_2c8._5_1_);
  auVar32[6] = -(tx_2.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] ==
                local_2c8._6_1_);
  auVar32[7] = -(tx_2.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] ==
                local_2c8._7_1_);
  auVar32[8] = -(tx_2.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] ==
                (uchar)uStack_2c0);
  auVar32[9] = -(tx_2.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] ==
                uStack_2c0._1_1_);
  auVar32[10] = -(tx_2.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                 uStack_2c0._2_1_);
  auVar32[0xb] = -(tx_2.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                  uStack_2c0._3_1_);
  auVar32[0xc] = -(tx_2.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                  uStack_2c0._4_1_);
  auVar32[0xd] = -(tx_2.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                  uStack_2c0._5_1_);
  auVar32[0xe] = -(tx_2.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                  uStack_2c0._6_1_);
  auVar32[0xf] = -(tx_2.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                  uStack_2c0._7_1_);
  auVar14[0] = -((class_property<bool>)
                 tx_2.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] ==
                local_2d8._0_1_);
  auVar14[1] = -(tx_2.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] ==
                local_2d8._1_1_);
  auVar14[2] = -(tx_2.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] ==
                local_2d8._2_1_);
  auVar14[3] = -(tx_2.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] ==
                local_2d8._3_1_);
  auVar14[4] = -(tx_2.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] ==
                local_2d8._4_1_);
  auVar14[5] = -(tx_2.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] ==
                local_2d8._5_1_);
  auVar14[6] = -(tx_2.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] ==
                local_2d8._6_1_);
  auVar14[7] = -(tx_2.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] ==
                local_2d8._7_1_);
  auVar14[8] = -(tx_2.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] ==
                (uchar)uStack_2d0);
  auVar14[9] = -(tx_2.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] ==
                uStack_2d0._1_1_);
  auVar14[10] = -(tx_2.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] ==
                 uStack_2d0._2_1_);
  auVar14[0xb] = -(tx_2.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] ==
                  uStack_2d0._3_1_);
  auVar14[0xc] = -(tx_2.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] ==
                  uStack_2d0._4_1_);
  auVar14[0xd] = -(tx_2.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] ==
                  uStack_2d0._5_1_);
  auVar14[0xe] = -(tx_2.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] ==
                  uStack_2d0._6_1_);
  auVar14[0xf] = -(tx_2.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] ==
                  uStack_2d0._7_1_);
  local_308 = boost::unit_test::lazy_ostream::inst;
  auVar14 = auVar14 & auVar32;
  local_338.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) | (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) == 0xffff);
  uStack_300 = "";
  local_338.m_message.px = (element_type *)0x0;
  local_338.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  uStack_350 = "";
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._M_value.super_base_blob<256U>.m_data._M_elems[8] = 0;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._0_8_ = &PTR__lazy_ostream_0138e0a0;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0] = (uchar)&local_2d8;
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[1] = (uchar)((ulong)&local_2d8 >> 8);
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[2] = (uchar)((ulong)&local_2d8 >> 0x10);
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[3] = (uchar)((ulong)&local_2d8 >> 0x18);
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[4] = (uchar)((ulong)&local_2d8 >> 0x20);
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[5] = (uchar)((ulong)&local_2d8 >> 0x28);
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[6] = (uchar)((ulong)&local_2d8 >> 0x30);
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[7] = (uchar)((ulong)&local_2d8 >> 0x38);
  local_58._8_8_ = local_58._9_8_ << 8;
  local_58._0_8_ = &PTR__lazy_ostream_0138e0a0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  aStack_48._8_8_ = &hash_if_by_txid;
  boost::test_tools::tt_detail::report_assertion
            (&local_338,&local_318,1,2,REQUIRE,0xf4398c,(size_t)&local_358,0x50,&u,"wtxid_2",
             local_58);
  boost::detail::shared_count::~shared_count(&local_338.m_message.pn);
  local_580 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_578 = "";
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  local_588 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x51;
  file_01.m_begin = (iterator)&local_580;
  msg_01.m_end = pvVar11;
  msg_01.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_590,
             msg_01);
  local_318._8_8_ = local_318._8_8_ & 0xffffffffffffff00;
  local_318._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  auVar33[0] = -(tx_3.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] ==
                (uchar)local_2e8);
  auVar33[1] = -(tx_3.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] ==
                local_2e8._1_1_);
  auVar33[2] = -(tx_3.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] ==
                local_2e8._2_1_);
  auVar33[3] = -(tx_3.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] ==
                local_2e8._3_1_);
  auVar33[4] = -(tx_3.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] ==
                local_2e8._4_1_);
  auVar33[5] = -(tx_3.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] ==
                local_2e8._5_1_);
  auVar33[6] = -(tx_3.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] ==
                local_2e8._6_1_);
  auVar33[7] = -(tx_3.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] ==
                local_2e8._7_1_);
  auVar33[8] = -(tx_3.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] ==
                (uchar)uStack_2e0);
  auVar33[9] = -(tx_3.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] ==
                uStack_2e0._1_1_);
  auVar33[10] = -(tx_3.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                 uStack_2e0._2_1_);
  auVar33[0xb] = -(tx_3.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                  uStack_2e0._3_1_);
  auVar33[0xc] = -(tx_3.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                  uStack_2e0._4_1_);
  auVar33[0xd] = -(tx_3.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                  uStack_2e0._5_1_);
  auVar33[0xe] = -(tx_3.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                  uStack_2e0._6_1_);
  auVar33[0xf] = -(tx_3.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                  uStack_2e0._7_1_);
  auVar15[0] = -(tx_3.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] ==
                (uchar)local_2f8);
  auVar15[1] = -(tx_3.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] ==
                local_2f8._1_1_);
  auVar15[2] = -(tx_3.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] ==
                local_2f8._2_1_);
  auVar15[3] = -(tx_3.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] ==
                local_2f8._3_1_);
  auVar15[4] = -(tx_3.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] ==
                local_2f8._4_1_);
  auVar15[5] = -(tx_3.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] ==
                local_2f8._5_1_);
  auVar15[6] = -(tx_3.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] ==
                local_2f8._6_1_);
  auVar15[7] = -(tx_3.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] ==
                local_2f8._7_1_);
  auVar15[8] = -(tx_3.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] ==
                (uchar)uStack_2f0);
  auVar15[9] = -(tx_3.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] ==
                uStack_2f0._1_1_);
  auVar15[10] = -(tx_3.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] ==
                 uStack_2f0._2_1_);
  auVar15[0xb] = -(tx_3.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] ==
                  uStack_2f0._3_1_);
  auVar15[0xc] = -(tx_3.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] ==
                  uStack_2f0._4_1_);
  auVar15[0xd] = -(tx_3.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] ==
                  uStack_2f0._5_1_);
  auVar15[0xe] = -(tx_3.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] ==
                  uStack_2f0._6_1_);
  auVar15[0xf] = -(tx_3.m_witness_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] ==
                  uStack_2f0._7_1_);
  local_308 = boost::unit_test::lazy_ostream::inst;
  auVar15 = auVar15 & auVar33;
  local_338.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) | (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) == 0xffff);
  uStack_300 = "";
  local_338.m_message.px = (element_type *)0x0;
  local_338.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  uStack_350 = "";
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems._0_8_ = &tx_3.m_witness_hash;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._M_value.super_base_blob<256U>.m_data._M_elems[8] = 0;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._0_8_ = &PTR__lazy_ostream_0138e0a0;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0] = (uchar)&local_2f8;
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[1] = (uchar)((ulong)&local_2f8 >> 8);
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[2] = (uchar)((ulong)&local_2f8 >> 0x10);
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[3] = (uchar)((ulong)&local_2f8 >> 0x18);
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[4] = (uchar)((ulong)&local_2f8 >> 0x20);
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[5] = (uchar)((ulong)&local_2f8 >> 0x28);
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[6] = (uchar)((ulong)&local_2f8 >> 0x30);
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[7] = (uchar)((ulong)&local_2f8 >> 0x38);
  local_58._8_8_ = local_58._9_8_ << 8;
  local_58._0_8_ = &PTR__lazy_ostream_0138e0a0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  aStack_48._8_8_ = &hash_if_by_txid;
  boost::test_tools::tt_detail::report_assertion
            (&local_338,&local_318,1,2,REQUIRE,0xf439aa,(size_t)&local_358,0x51,&u,"wtxid_3",
             local_58);
  boost::detail::shared_count::~shared_count(&local_338.m_message.pn);
  local_5a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_598 = "";
  local_5b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x53;
  file_02.m_begin = (iterator)&local_5a0;
  msg_02.m_end = pvVar11;
  msg_02.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_5b0,
             msg_02);
  base_blob<256u>::GetHex_abi_cxx11_((string *)&u,&local_2b8);
  _cVar49 = 0x67cec6;
  base_blob<256u>::GetHex_abi_cxx11_((string *)local_58,&local_2d8);
  uVar3 = u.super__Optional_base<uint256,_true,_true>._M_payload.
          super__Optional_payload_base<uint256>._M_payload._8_8_;
  uVar4 = local_58._8_8_;
  uVar9 = u.super__Optional_base<uint256,_true,_true>._M_payload.
          super__Optional_payload_base<uint256>._M_payload._8_8_;
  if ((ulong)local_58._8_8_ <
      (ulong)u.super__Optional_base<uint256,_true,_true>._M_payload.
             super__Optional_payload_base<uint256>._M_payload._8_8_) {
    uVar9 = local_58._8_8_;
  }
  if ((element_type *)uVar9 == (element_type *)0x0) {
LAB_0067cf13:
    uVar7 = 0xffffffff80000000;
    if (-0x80000000 < (long)(uVar3 - uVar4)) {
      uVar7 = uVar3 - uVar4;
    }
    if (0x7ffffffe < (long)uVar7) {
      uVar7 = 0;
    }
  }
  else {
    _cVar49 = 0x67cf0f;
    uVar5 = memcmp((void *)u.super__Optional_base<uint256,_true,_true>._M_payload.
                           super__Optional_payload_base<uint256>._M_payload._0_8_,
                   (void *)local_58._0_8_,uVar9);
    uVar7 = (ulong)uVar5;
    if (uVar5 == 0) goto LAB_0067cf13;
  }
  local_338._0_8_ = CONCAT71(local_338._1_7_,(char)(uVar7 >> 0x1f)) & 0xffffffffffffff01;
  local_338.m_message.px = (element_type *)0x0;
  local_338.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_358 = "wtxid_1.GetHex() < wtxid_2.GetHex()";
  uStack_350 = "";
  local_318._8_8_ = local_318._8_8_ & 0xffffffffffffff00;
  local_318._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_308 = boost::unit_test::lazy_ostream::inst;
  uStack_300 = (char *)&local_358;
  local_5c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_5b8 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_338,&local_318,1,0,WARN,_cVar49,(size_t)&local_5c0,0x53);
  boost::detail::shared_count::~shared_count(&local_338.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &aStack_48) {
    operator_delete((void *)local_58._0_8_,aStack_48._M_allocated_capacity + 1);
  }
  puVar1 = (undefined1 *)
           ((long)&u.super__Optional_base<uint256,_true,_true>._M_payload.
                   super__Optional_payload_base<uint256>._M_payload + 0x10);
  if ((undefined1 *)
      u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
      _M_payload._0_8_ != puVar1) {
    operator_delete((void *)u.super__Optional_base<uint256,_true,_true>._M_payload.
                            super__Optional_payload_base<uint256>._M_payload._0_8_,
                    u.super__Optional_base<uint256,_true,_true>._M_payload.
                    super__Optional_payload_base<uint256>._M_payload._16_8_ + 1);
  }
  local_5d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_5c8 = "";
  local_5e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x54;
  file_03.m_begin = (iterator)&local_5d0;
  msg_03.m_end = pvVar11;
  msg_03.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_5e0,
             msg_03);
  base_blob<256u>::GetHex_abi_cxx11_((string *)&u,&local_2d8);
  _cVar49 = 0x67d06b;
  base_blob<256u>::GetHex_abi_cxx11_((string *)local_58,&local_2f8);
  uVar3 = u.super__Optional_base<uint256,_true,_true>._M_payload.
          super__Optional_payload_base<uint256>._M_payload._8_8_;
  uVar4 = local_58._8_8_;
  uVar9 = u.super__Optional_base<uint256,_true,_true>._M_payload.
          super__Optional_payload_base<uint256>._M_payload._8_8_;
  if ((ulong)local_58._8_8_ <
      (ulong)u.super__Optional_base<uint256,_true,_true>._M_payload.
             super__Optional_payload_base<uint256>._M_payload._8_8_) {
    uVar9 = local_58._8_8_;
  }
  if ((element_type *)uVar9 == (element_type *)0x0) {
LAB_0067d0b1:
    uVar7 = 0xffffffff80000000;
    if (-0x80000000 < (long)(uVar3 - uVar4)) {
      uVar7 = uVar3 - uVar4;
    }
    if (0x7ffffffe < (long)uVar7) {
      uVar7 = 0;
    }
  }
  else {
    _cVar49 = 0x67d0ad;
    uVar5 = memcmp((void *)u.super__Optional_base<uint256,_true,_true>._M_payload.
                           super__Optional_payload_base<uint256>._M_payload._0_8_,
                   (void *)local_58._0_8_,uVar9);
    uVar7 = (ulong)uVar5;
    if (uVar5 == 0) goto LAB_0067d0b1;
  }
  local_338._0_8_ = CONCAT71(local_338._1_7_,(char)(uVar7 >> 0x1f)) & 0xffffffffffffff01;
  local_338.m_message.px = (element_type *)0x0;
  local_338.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_358 = "wtxid_2.GetHex() < wtxid_3.GetHex()";
  uStack_350 = "";
  local_318._8_8_ = local_318._8_8_ & 0xffffffffffffff00;
  local_318._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_308 = boost::unit_test::lazy_ostream::inst;
  uStack_300 = (char *)&local_358;
  local_5f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_5e8 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  pcVar8 = (char *)0x54;
  boost::test_tools::tt_detail::report_assertion
            (&local_338,&local_318,1,0,WARN,_cVar49,(size_t)&local_5f0,0x54);
  boost::detail::shared_count::~shared_count(&local_338.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &aStack_48) {
    operator_delete((void *)local_58._0_8_,aStack_48._M_allocated_capacity + 1);
  }
  if ((undefined1 *)
      u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
      _M_payload._0_8_ != puVar1) {
    operator_delete((void *)u.super__Optional_base<uint256,_true,_true>._M_payload.
                            super__Optional_payload_base<uint256>._M_payload._0_8_,
                    u.super__Optional_base<uint256,_true,_true>._M_payload.
                    super__Optional_payload_base<uint256>._M_payload._16_8_ + 1);
  }
  str_02._M_str = pcVar8;
  str_02._M_len = (size_t)"bd0f71c1d5e50589063e134fad22053cdae5ab2320db5bf5e540198b0b5a4e69";
  detail::FromHex<uint256>(&u,(detail *)0x40,str_02);
  if (u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
      _M_engaged == false) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      std::__throw_bad_optional_access();
    }
    goto LAB_0067f8a0;
  }
  local_308 = (undefined1 *)
              u.super__Optional_base<uint256,_true,_true>._M_payload.
              super__Optional_payload_base<uint256>._M_payload._16_8_;
  uStack_300 = (char *)u.super__Optional_base<uint256,_true,_true>._M_payload.
                       super__Optional_payload_base<uint256>._M_payload._24_8_;
  local_318._vptr_lazy_ostream =
       (_func_int **)
       u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
       _M_payload._0_8_;
  local_318._8_8_ =
       u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
       _M_payload._8_8_;
  str_03._M_str = pcVar8;
  str_03._M_len = (size_t)"b4749f017444b051c44dfd2720e88f314ff94f3dd6d56d40ef65854fcd7fff6b";
  detail::FromHex<uint256>(&u,(detail *)0x40,str_03);
  if (u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
      _M_engaged == false) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      std::__throw_bad_optional_access();
    }
    goto LAB_0067f8a0;
  }
  uStack_320 = u.super__Optional_base<uint256,_true,_true>._M_payload.
               super__Optional_payload_base<uint256>._M_payload._24_8_;
  local_338._0_8_ =
       u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
       _M_payload._0_8_;
  local_338.m_message.pn.pi_ =
       (sp_counted_base *)
       u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
       _M_payload._16_8_;
  local_338.m_message.px =
       (element_type *)
       u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
       _M_payload._8_8_;
  str_04._M_str = pcVar8;
  str_04._M_len = (size_t)"ee707be5201160e32c4fc715bec227d1aeea5940fb4295605e7373edce3b1a93";
  detail::FromHex<uint256>(&u,(detail *)0x40,str_04);
  if (u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
      _M_engaged == false) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      std::__throw_bad_optional_access();
    }
    goto LAB_0067f8a0;
  }
  local_348 = u.super__Optional_base<uint256,_true,_true>._M_payload.
              super__Optional_payload_base<uint256>._M_payload._16_8_;
  uStack_340 = u.super__Optional_base<uint256,_true,_true>._M_payload.
               super__Optional_payload_base<uint256>._M_payload._24_8_;
  local_358 = (char *)u.super__Optional_base<uint256,_true,_true>._M_payload.
                      super__Optional_payload_base<uint256>._M_payload._0_8_;
  uStack_350 = (char *)u.super__Optional_base<uint256,_true,_true>._M_payload.
                       super__Optional_payload_base<uint256>._M_payload._8_8_;
  local_600 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_5f8 = "";
  local_610 = &boost::unit_test::basic_cstring<char_const>::null;
  local_608 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x5a;
  file_04.m_begin = (iterator)&local_600;
  msg_04.m_end = pvVar11;
  msg_04.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_610,
             msg_04);
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems._0_8_ = &tx_1.hash;
  auVar34[0] = -(tx_1.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] == (uchar)local_308
                );
  auVar34[1] = -(tx_1.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] == local_308._1_1_)
  ;
  auVar34[2] = -(tx_1.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] == local_308._2_1_)
  ;
  auVar34[3] = -(tx_1.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] == local_308._3_1_)
  ;
  auVar34[4] = -(tx_1.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] == local_308._4_1_)
  ;
  auVar34[5] = -(tx_1.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] == local_308._5_1_)
  ;
  auVar34[6] = -(tx_1.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] == local_308._6_1_)
  ;
  auVar34[7] = -(tx_1.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] == local_308._7_1_)
  ;
  auVar34[8] = -(tx_1.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] ==
                (uchar)uStack_300);
  auVar34[9] = -(tx_1.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] == uStack_300._1_1_
                );
  auVar34[10] = -(tx_1.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                 uStack_300._2_1_);
  auVar34[0xb] = -(tx_1.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                  uStack_300._3_1_);
  auVar34[0xc] = -(tx_1.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                  uStack_300._4_1_);
  auVar34[0xd] = -(tx_1.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                  uStack_300._5_1_);
  auVar34[0xe] = -(tx_1.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                  uStack_300._6_1_);
  auVar34[0xf] = -(tx_1.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                  uStack_300._7_1_);
  auVar16[0] = -(tx_1.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] ==
                (uchar)local_318._vptr_lazy_ostream);
  auVar16[1] = -(tx_1.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] ==
                local_318._vptr_lazy_ostream._1_1_);
  auVar16[2] = -(tx_1.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] ==
                local_318._vptr_lazy_ostream._2_1_);
  auVar16[3] = -(tx_1.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] ==
                local_318._vptr_lazy_ostream._3_1_);
  auVar16[4] = -(tx_1.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] ==
                local_318._vptr_lazy_ostream._4_1_);
  auVar16[5] = -(tx_1.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] ==
                local_318._vptr_lazy_ostream._5_1_);
  auVar16[6] = -(tx_1.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] ==
                local_318._vptr_lazy_ostream._6_1_);
  auVar16[7] = -(tx_1.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] ==
                local_318._vptr_lazy_ostream._7_1_);
  auVar16[8] = -((bool)tx_1.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] ==
                local_318.m_empty);
  auVar16[9] = -(tx_1.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] == local_318._9_1_);
  auVar16[10] = -(tx_1.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] == local_318._10_1_)
  ;
  auVar16[0xb] = -(tx_1.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] ==
                  local_318._11_1_);
  auVar16[0xc] = -(tx_1.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] ==
                  local_318._12_1_);
  auVar16[0xd] = -(tx_1.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] ==
                  local_318._13_1_);
  auVar16[0xe] = -(tx_1.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] ==
                  local_318._14_1_);
  auVar16[0xf] = -(tx_1.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] ==
                  local_318._15_1_);
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01388f08;
  auVar16 = auVar16 & auVar34;
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0] =
       (ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) | (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) == 0xffff;
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems._24_8_ =
       (long)"\x05\x04\x03\x02\x01" + 5;
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  hash_if_use_txid.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_19c8ce0;
  hash_if_use_txid.super_base_blob<256U>.m_data._M_elems._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
       + 0x68;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._M_value.super_base_blob<256U>.m_data._M_elems[8] = 0;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._0_8_ = &PTR__lazy_ostream_01389af8;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._24_8_ = &hash_if_use_int_order;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = local_8d0;
  local_58._8_8_ = local_58._9_8_ << 8;
  local_58._0_8_ = &PTR__lazy_ostream_01389af8;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_8d0._0_8_ = &local_318;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&hash_if_by_txid,(lazy_ostream *)&calculated_hash_123,1,2,REQUIRE,
             0xf43a8a,(size_t)&hash_if_use_txid,0x5a,&u,"txid_1",local_58);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(hash_if_by_txid.super_base_blob<256U>.m_data._M_elems + 0x10));
  local_620 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_618 = "";
  local_630 = &boost::unit_test::basic_cstring<char_const>::null;
  local_628 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x5b;
  file_05.m_begin = (iterator)&local_620;
  msg_05.m_end = pvVar11;
  msg_05.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_630,
             msg_05);
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01388f08;
  hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems._0_8_ = &tx_2.hash;
  auVar35[0] = -(tx_2.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] ==
                (uchar)local_338.m_message.pn.pi_);
  auVar35[1] = -(tx_2.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] ==
                local_338.m_message.pn.pi_._1_1_);
  auVar35[2] = -(tx_2.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] ==
                local_338.m_message.pn.pi_._2_1_);
  auVar35[3] = -(tx_2.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] ==
                local_338.m_message.pn.pi_._3_1_);
  auVar35[4] = -(tx_2.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] ==
                local_338.m_message.pn.pi_._4_1_);
  auVar35[5] = -(tx_2.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] ==
                local_338.m_message.pn.pi_._5_1_);
  auVar35[6] = -(tx_2.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] ==
                local_338.m_message.pn.pi_._6_1_);
  auVar35[7] = -(tx_2.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] ==
                local_338.m_message.pn.pi_._7_1_);
  auVar35[8] = -(tx_2.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] ==
                (uchar)uStack_320);
  auVar35[9] = -(tx_2.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] == uStack_320._1_1_
                );
  auVar35[10] = -(tx_2.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                 uStack_320._2_1_);
  auVar35[0xb] = -(tx_2.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                  uStack_320._3_1_);
  auVar35[0xc] = -(tx_2.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                  uStack_320._4_1_);
  auVar35[0xd] = -(tx_2.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                  uStack_320._5_1_);
  auVar35[0xe] = -(tx_2.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                  uStack_320._6_1_);
  auVar35[0xf] = -(tx_2.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                  uStack_320._7_1_);
  auVar17[0] = -((readonly_property<bool>)
                 tx_2.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] ==
                local_338.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>
                .value);
  auVar17[1] = -(tx_2.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] == local_338._1_1_);
  auVar17[2] = -(tx_2.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] == local_338._2_1_);
  auVar17[3] = -(tx_2.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] == local_338._3_1_);
  auVar17[4] = -(tx_2.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] == local_338._4_1_);
  auVar17[5] = -(tx_2.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] == local_338._5_1_);
  auVar17[6] = -(tx_2.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] == local_338._6_1_);
  auVar17[7] = -(tx_2.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] == local_338._7_1_);
  auVar17[8] = -(tx_2.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] ==
                (uchar)local_338.m_message.px);
  auVar17[9] = -(tx_2.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] ==
                local_338.m_message.px._1_1_);
  auVar17[10] = -(tx_2.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] ==
                 local_338.m_message.px._2_1_);
  auVar17[0xb] = -(tx_2.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] ==
                  local_338.m_message.px._3_1_);
  auVar17[0xc] = -(tx_2.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] ==
                  local_338.m_message.px._4_1_);
  auVar17[0xd] = -(tx_2.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] ==
                  local_338.m_message.px._5_1_);
  auVar17[0xe] = -(tx_2.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] ==
                  local_338.m_message.px._6_1_);
  auVar17[0xf] = -(tx_2.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] ==
                  local_338.m_message.px._7_1_);
  auVar17 = auVar17 & auVar35;
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0] =
       (ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) | (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) == 0xffff;
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems._24_8_ =
       (long)"\x05\x04\x03\x02\x01" + 5;
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  hash_if_use_txid.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_19c8ce0;
  hash_if_use_txid.super_base_blob<256U>.m_data._M_elems._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
       + 0x68;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._M_value.super_base_blob<256U>.m_data._M_elems[8] = 0;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._0_8_ = &PTR__lazy_ostream_01389af8;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._24_8_ = &hash_if_use_int_order;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_58._8_8_ = local_58._9_8_ << 8;
  local_58._0_8_ = &PTR__lazy_ostream_01389af8;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = local_8d0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_8d0._0_8_ = &local_338;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&hash_if_by_txid,(lazy_ostream *)&calculated_hash_123,1,2,REQUIRE,
             0xf43a99,(size_t)&hash_if_use_txid,0x5b,&u,"txid_2",local_58);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(hash_if_by_txid.super_base_blob<256U>.m_data._M_elems + 0x10));
  local_640 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_638 = "";
  local_650 = &boost::unit_test::basic_cstring<char_const>::null;
  local_648 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x5c;
  file_06.m_begin = (iterator)&local_640;
  msg_06.m_end = pvVar11;
  msg_06.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_650,
             msg_06);
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01388f08;
  auVar36[0] = -(tx_3.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] == (uchar)local_348
                );
  auVar36[1] = -(tx_3.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] == local_348._1_1_)
  ;
  auVar36[2] = -(tx_3.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] == local_348._2_1_)
  ;
  auVar36[3] = -(tx_3.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] == local_348._3_1_)
  ;
  auVar36[4] = -(tx_3.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] == local_348._4_1_)
  ;
  auVar36[5] = -(tx_3.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] == local_348._5_1_)
  ;
  auVar36[6] = -(tx_3.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] == local_348._6_1_)
  ;
  auVar36[7] = -(tx_3.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] == local_348._7_1_)
  ;
  auVar36[8] = -(tx_3.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] ==
                (uchar)uStack_340);
  auVar36[9] = -(tx_3.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] == uStack_340._1_1_
                );
  auVar36[10] = -(tx_3.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                 uStack_340._2_1_);
  auVar36[0xb] = -(tx_3.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                  uStack_340._3_1_);
  auVar36[0xc] = -(tx_3.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                  uStack_340._4_1_);
  auVar36[0xd] = -(tx_3.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                  uStack_340._5_1_);
  auVar36[0xe] = -(tx_3.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                  uStack_340._6_1_);
  auVar36[0xf] = -(tx_3.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                  uStack_340._7_1_);
  auVar18[0] = -(tx_3.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] == (uchar)local_358);
  auVar18[1] = -(tx_3.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] == local_358._1_1_);
  auVar18[2] = -(tx_3.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] == local_358._2_1_);
  auVar18[3] = -(tx_3.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] == local_358._3_1_);
  auVar18[4] = -(tx_3.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] == local_358._4_1_);
  auVar18[5] = -(tx_3.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] == local_358._5_1_);
  auVar18[6] = -(tx_3.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] == local_358._6_1_);
  auVar18[7] = -(tx_3.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] == local_358._7_1_);
  auVar18[8] = -(tx_3.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] == (uchar)uStack_350);
  auVar18[9] = -(tx_3.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] == uStack_350._1_1_);
  auVar18[10] = -(tx_3.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] == uStack_350._2_1_)
  ;
  auVar18[0xb] = -(tx_3.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] ==
                  uStack_350._3_1_);
  auVar18[0xc] = -(tx_3.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] ==
                  uStack_350._4_1_);
  auVar18[0xd] = -(tx_3.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] ==
                  uStack_350._5_1_);
  auVar18[0xe] = -(tx_3.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] ==
                  uStack_350._6_1_);
  auVar18[0xf] = -(tx_3.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] ==
                  uStack_350._7_1_);
  auVar18 = auVar18 & auVar36;
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0] =
       (ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) | (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) == 0xffff;
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems._24_8_ =
       (long)"\x05\x04\x03\x02\x01" + 5;
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  hash_if_use_txid.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_19c8ce0;
  hash_if_use_txid.super_base_blob<256U>.m_data._M_elems._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
       + 0x68;
  hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems._0_8_ = &tx_3.hash;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._M_value.super_base_blob<256U>.m_data._M_elems[8] = 0;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._0_8_ = &PTR__lazy_ostream_01389af8;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._24_8_ = &hash_if_use_int_order;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_8d0._0_8_ = &local_358;
  local_58._8_8_ = local_58._9_8_ << 8;
  local_58._0_8_ = &PTR__lazy_ostream_01389af8;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = local_8d0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&hash_if_by_txid,(lazy_ostream *)&calculated_hash_123,1,2,REQUIRE,
             0xf43aa8,(size_t)&hash_if_use_txid,0x5c,&u,"txid_3",local_58);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(hash_if_by_txid.super_base_blob<256U>.m_data._M_elems + 0x10));
  local_660 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_658 = "";
  local_670 = &boost::unit_test::basic_cstring<char_const>::null;
  local_668 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x5e;
  file_07.m_begin = (iterator)&local_660;
  msg_07.m_end = pvVar11;
  msg_07.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_670,
             msg_07);
  base_blob<256u>::GetHex_abi_cxx11_((string *)&u,&local_338);
  _cVar49 = 0x67d72c;
  base_blob<256u>::GetHex_abi_cxx11_((string *)local_58,&local_318);
  uVar3 = u.super__Optional_base<uint256,_true,_true>._M_payload.
          super__Optional_payload_base<uint256>._M_payload._8_8_;
  uVar4 = local_58._8_8_;
  uVar9 = u.super__Optional_base<uint256,_true,_true>._M_payload.
          super__Optional_payload_base<uint256>._M_payload._8_8_;
  if ((ulong)local_58._8_8_ <
      (ulong)u.super__Optional_base<uint256,_true,_true>._M_payload.
             super__Optional_payload_base<uint256>._M_payload._8_8_) {
    uVar9 = local_58._8_8_;
  }
  if ((element_type *)uVar9 == (element_type *)0x0) {
LAB_0067d779:
    uVar7 = 0xffffffff80000000;
    if (-0x80000000 < (long)(uVar3 - uVar4)) {
      uVar7 = uVar3 - uVar4;
    }
    if (0x7ffffffe < (long)uVar7) {
      uVar7 = 0;
    }
  }
  else {
    _cVar49 = 0x67d775;
    uVar5 = memcmp((void *)u.super__Optional_base<uint256,_true,_true>._M_payload.
                           super__Optional_payload_base<uint256>._M_payload._0_8_,
                   (void *)local_58._0_8_,uVar9);
    uVar7 = (ulong)uVar5;
    if (uVar5 == 0) goto LAB_0067d779;
  }
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0] = (byte)(uVar7 >> 0x1f) & 1;
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  hash_if_use_txid.super_base_blob<256U>.m_data._M_elems._8_8_ = "";
  hash_if_use_txid.super_base_blob<256U>.m_data._M_elems._0_8_ = "txid_2.GetHex() < txid_1.GetHex()"
  ;
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems._24_8_ = &hash_if_use_txid;
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_680 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_678 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&hash_if_by_txid,(lazy_ostream *)&calculated_hash_123,1,0,WARN,
             _cVar49,(size_t)&local_680,0x5e);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(hash_if_by_txid.super_base_blob<256U>.m_data._M_elems + 0x10));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &aStack_48) {
    operator_delete((void *)local_58._0_8_,aStack_48._M_allocated_capacity + 1);
  }
  if ((undefined1 *)
      u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
      _M_payload._0_8_ !=
      (undefined1 *)
      ((long)&u.super__Optional_base<uint256,_true,_true>._M_payload.
              super__Optional_payload_base<uint256>._M_payload + 0x10)) {
    operator_delete((void *)u.super__Optional_base<uint256,_true,_true>._M_payload.
                            super__Optional_payload_base<uint256>._M_payload._0_8_,
                    u.super__Optional_base<uint256,_true,_true>._M_payload.
                    super__Optional_payload_base<uint256>._M_payload._16_8_ + 1);
  }
  local_690 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_688 = "";
  local_6a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_698 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar49 = 0x67d8ab;
  file_08.m_end = (iterator)0x60;
  file_08.m_begin = (iterator)&local_690;
  msg_08.m_end = pvVar11;
  msg_08.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_6a0,
             msg_08);
  auVar37[0] = -((uchar)local_308 == (uchar)local_2a8);
  auVar37[1] = -(local_308._1_1_ == local_2a8._1_1_);
  auVar37[2] = -(local_308._2_1_ == local_2a8._2_1_);
  auVar37[3] = -(local_308._3_1_ == local_2a8._3_1_);
  auVar37[4] = -(local_308._4_1_ == local_2a8._4_1_);
  auVar37[5] = -(local_308._5_1_ == local_2a8._5_1_);
  auVar37[6] = -(local_308._6_1_ == local_2a8._6_1_);
  auVar37[7] = -(local_308._7_1_ == local_2a8._7_1_);
  auVar37[8] = -((uchar)uStack_300 == (uchar)uStack_2a0);
  auVar37[9] = -(uStack_300._1_1_ == uStack_2a0._1_1_);
  auVar37[10] = -(uStack_300._2_1_ == uStack_2a0._2_1_);
  auVar37[0xb] = -(uStack_300._3_1_ == uStack_2a0._3_1_);
  auVar37[0xc] = -(uStack_300._4_1_ == uStack_2a0._4_1_);
  auVar37[0xd] = -(uStack_300._5_1_ == uStack_2a0._5_1_);
  auVar37[0xe] = -(uStack_300._6_1_ == uStack_2a0._6_1_);
  auVar37[0xf] = -(uStack_300._7_1_ == uStack_2a0._7_1_);
  auVar19[0] = -((uchar)local_318._vptr_lazy_ostream == (uchar)local_2b8);
  auVar19[1] = -(local_318._vptr_lazy_ostream._1_1_ == local_2b8._1_1_);
  auVar19[2] = -(local_318._vptr_lazy_ostream._2_1_ == local_2b8._2_1_);
  auVar19[3] = -(local_318._vptr_lazy_ostream._3_1_ == local_2b8._3_1_);
  auVar19[4] = -(local_318._vptr_lazy_ostream._4_1_ == local_2b8._4_1_);
  auVar19[5] = -(local_318._vptr_lazy_ostream._5_1_ == local_2b8._5_1_);
  auVar19[6] = -(local_318._vptr_lazy_ostream._6_1_ == local_2b8._6_1_);
  auVar19[7] = -(local_318._vptr_lazy_ostream._7_1_ == local_2b8._7_1_);
  auVar19[8] = -(local_318.m_empty == (bool)(uchar)uStack_2b0);
  auVar19[9] = -(local_318._9_1_ == uStack_2b0._1_1_);
  auVar19[10] = -(local_318._10_1_ == uStack_2b0._2_1_);
  auVar19[0xb] = -(local_318._11_1_ == uStack_2b0._3_1_);
  auVar19[0xc] = -(local_318._12_1_ == uStack_2b0._4_1_);
  auVar19[0xd] = -(local_318._13_1_ == uStack_2b0._5_1_);
  auVar19[0xe] = -(local_318._14_1_ == uStack_2b0._6_1_);
  auVar19[0xf] = -(local_318._15_1_ == uStack_2b0._7_1_);
  auVar19 = auVar19 & auVar37;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_19d5f34;
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems._8_8_ =
       (long)"txid_1.ToUint256() != wtxid_1.ToUint256()" + 0x29;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._M_value.super_base_blob<256U>.m_data._M_elems[8] = 0;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._0_8_ = &PTR__lazy_ostream_01389048;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._24_8_ = (lazy_ostream *)&calculated_hash_123;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_6b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_6a8 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_58[0] = (class_property<bool>)
                (class_property<bool>)
                ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) != 0xffff);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)&u,1,0,WARN,_cVar49,(size_t)&local_6b0,
             0x60);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  local_6c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_6b8 = "";
  local_6d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6c8 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar49 = 0x67d9a4;
  file_09.m_end = (iterator)0x61;
  file_09.m_begin = (iterator)&local_6c0;
  msg_09.m_end = pvVar11;
  msg_09.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_6d0,
             msg_09);
  auVar38[0] = -((uchar)local_338.m_message.pn.pi_ == (uchar)local_2c8);
  auVar38[1] = -(local_338.m_message.pn.pi_._1_1_ == local_2c8._1_1_);
  auVar38[2] = -(local_338.m_message.pn.pi_._2_1_ == local_2c8._2_1_);
  auVar38[3] = -(local_338.m_message.pn.pi_._3_1_ == local_2c8._3_1_);
  auVar38[4] = -(local_338.m_message.pn.pi_._4_1_ == local_2c8._4_1_);
  auVar38[5] = -(local_338.m_message.pn.pi_._5_1_ == local_2c8._5_1_);
  auVar38[6] = -(local_338.m_message.pn.pi_._6_1_ == local_2c8._6_1_);
  auVar38[7] = -(local_338.m_message.pn.pi_._7_1_ == local_2c8._7_1_);
  auVar38[8] = -((uchar)uStack_320 == (uchar)uStack_2c0);
  auVar38[9] = -(uStack_320._1_1_ == uStack_2c0._1_1_);
  auVar38[10] = -(uStack_320._2_1_ == uStack_2c0._2_1_);
  auVar38[0xb] = -(uStack_320._3_1_ == uStack_2c0._3_1_);
  auVar38[0xc] = -(uStack_320._4_1_ == uStack_2c0._4_1_);
  auVar38[0xd] = -(uStack_320._5_1_ == uStack_2c0._5_1_);
  auVar38[0xe] = -(uStack_320._6_1_ == uStack_2c0._6_1_);
  auVar38[0xf] = -(uStack_320._7_1_ == uStack_2c0._7_1_);
  auVar20[0] = -(local_338.p_predicate_value.super_readonly_property<bool>.
                 super_class_property<bool>.value == (readonly_property<bool>)local_2d8._0_1_);
  auVar20[1] = -(local_338._1_1_ == local_2d8._1_1_);
  auVar20[2] = -(local_338._2_1_ == local_2d8._2_1_);
  auVar20[3] = -(local_338._3_1_ == local_2d8._3_1_);
  auVar20[4] = -(local_338._4_1_ == local_2d8._4_1_);
  auVar20[5] = -(local_338._5_1_ == local_2d8._5_1_);
  auVar20[6] = -(local_338._6_1_ == local_2d8._6_1_);
  auVar20[7] = -(local_338._7_1_ == local_2d8._7_1_);
  auVar20[8] = -((uchar)local_338.m_message.px == (uchar)uStack_2d0);
  auVar20[9] = -(local_338.m_message.px._1_1_ == uStack_2d0._1_1_);
  auVar20[10] = -(local_338.m_message.px._2_1_ == uStack_2d0._2_1_);
  auVar20[0xb] = -(local_338.m_message.px._3_1_ == uStack_2d0._3_1_);
  auVar20[0xc] = -(local_338.m_message.px._4_1_ == uStack_2d0._4_1_);
  auVar20[0xd] = -(local_338.m_message.px._5_1_ == uStack_2d0._5_1_);
  auVar20[0xe] = -(local_338.m_message.px._6_1_ == uStack_2d0._6_1_);
  auVar20[0xf] = -(local_338.m_message.px._7_1_ == uStack_2d0._7_1_);
  auVar20 = auVar20 & auVar38;
  local_58[0] = (class_property<bool>)
                ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar20[0xf] >> 7) << 0xf) == 0xffff);
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_19d5f4d;
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems._8_8_ =
       (long)"txid_2.ToUint256() == wtxid_2.ToUint256()" + 0x29;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._M_value.super_base_blob<256U>.m_data._M_elems[8] = 0;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._0_8_ = &PTR__lazy_ostream_01389048;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_6e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_6d8 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)&u,1,0,WARN,_cVar49,(size_t)&local_6e0,
             0x61);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  local_6f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_6e8 = "";
  local_700 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6f8 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar49 = 0x67daa3;
  file_10.m_end = (iterator)0x62;
  file_10.m_begin = (iterator)&local_6f0;
  msg_10.m_end = pvVar11;
  msg_10.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_700,
             msg_10);
  auVar39[0] = -((uchar)local_348 == (uchar)local_2e8);
  auVar39[1] = -(local_348._1_1_ == local_2e8._1_1_);
  auVar39[2] = -(local_348._2_1_ == local_2e8._2_1_);
  auVar39[3] = -(local_348._3_1_ == local_2e8._3_1_);
  auVar39[4] = -(local_348._4_1_ == local_2e8._4_1_);
  auVar39[5] = -(local_348._5_1_ == local_2e8._5_1_);
  auVar39[6] = -(local_348._6_1_ == local_2e8._6_1_);
  auVar39[7] = -(local_348._7_1_ == local_2e8._7_1_);
  auVar39[8] = -((uchar)uStack_340 == (uchar)uStack_2e0);
  auVar39[9] = -(uStack_340._1_1_ == uStack_2e0._1_1_);
  auVar39[10] = -(uStack_340._2_1_ == uStack_2e0._2_1_);
  auVar39[0xb] = -(uStack_340._3_1_ == uStack_2e0._3_1_);
  auVar39[0xc] = -(uStack_340._4_1_ == uStack_2e0._4_1_);
  auVar39[0xd] = -(uStack_340._5_1_ == uStack_2e0._5_1_);
  auVar39[0xe] = -(uStack_340._6_1_ == uStack_2e0._6_1_);
  auVar39[0xf] = -(uStack_340._7_1_ == uStack_2e0._7_1_);
  auVar21[0] = -((uchar)local_358 == (uchar)local_2f8);
  auVar21[1] = -(local_358._1_1_ == local_2f8._1_1_);
  auVar21[2] = -(local_358._2_1_ == local_2f8._2_1_);
  auVar21[3] = -(local_358._3_1_ == local_2f8._3_1_);
  auVar21[4] = -(local_358._4_1_ == local_2f8._4_1_);
  auVar21[5] = -(local_358._5_1_ == local_2f8._5_1_);
  auVar21[6] = -(local_358._6_1_ == local_2f8._6_1_);
  auVar21[7] = -(local_358._7_1_ == local_2f8._7_1_);
  auVar21[8] = -((uchar)uStack_350 == (uchar)uStack_2f0);
  auVar21[9] = -(uStack_350._1_1_ == uStack_2f0._1_1_);
  auVar21[10] = -(uStack_350._2_1_ == uStack_2f0._2_1_);
  auVar21[0xb] = -(uStack_350._3_1_ == uStack_2f0._3_1_);
  auVar21[0xc] = -(uStack_350._4_1_ == uStack_2f0._4_1_);
  auVar21[0xd] = -(uStack_350._5_1_ == uStack_2f0._5_1_);
  auVar21[0xe] = -(uStack_350._6_1_ == uStack_2f0._6_1_);
  auVar21[0xf] = -(uStack_350._7_1_ == uStack_2f0._7_1_);
  auVar21 = auVar21 & auVar39;
  local_58[0] = (class_property<bool>)
                ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar21[0xf] >> 7) << 0xf) != 0xffff);
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_19d5f58;
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems._8_8_ =
       (long)"txid_3.ToUint256() != wtxid_3.ToUint256()" + 0x29;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._M_value.super_base_blob<256U>.m_data._M_elems[8] = 0;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._0_8_ = &PTR__lazy_ostream_01389048;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_710 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_708 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)&u,1,0,WARN,_cVar49,(size_t)&local_710,
             0x62);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  local_720 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_718 = "";
  local_730 = &boost::unit_test::basic_cstring<char_const>::null;
  local_728 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x66;
  file_11.m_begin = (iterator)&local_720;
  msg_11.m_end = pvVar11;
  msg_11.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_730,
             msg_11);
  _cVar49 = 0x67dbb6;
  iVar6 = memcmp(&local_2d8,&local_2b8,0x20);
  local_58[0] = SUB41((uint)iVar6 >> 0x1f,0);
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_19d5f63;
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems._8_8_ = (long)"wtxid_2 < wtxid_1" + 0x11
  ;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._M_value.super_base_blob<256U>.m_data._M_elems[8] = 0;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._0_8_ = &PTR__lazy_ostream_01389048;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_740 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_738 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)&u,1,0,WARN,_cVar49,(size_t)&local_740,
             0x66);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  local_750 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_748 = "";
  local_760 = &boost::unit_test::basic_cstring<char_const>::null;
  local_758 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = &DAT_00000068;
  file_12.m_begin = (iterator)&local_750;
  msg_12.m_end = pvVar11;
  msg_12.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_760,
             msg_12);
  _cVar49 = 0x67dc9a;
  iVar6 = memcmp(&local_2d8,&local_2f8,0x20);
  local_58[0] = (class_property<bool>)(class_property<bool>)(byte)((uint)iVar6 >> 0x1f);
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems._8_8_ = "";
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems._0_8_ = "wtxid_2 < wtxid_3";
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._M_value.super_base_blob<256U>.m_data._M_elems[8] = 0;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._0_8_ = &PTR__lazy_ostream_01389048;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_770 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_768 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)&u,1,0,WARN,_cVar49,(size_t)&local_770,
             0x68);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._8_8_ =
       ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._0_8_ = ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if (ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._24_8_ =
       ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._16_8_ =
       ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  _Stack_3c0 = (__shared_count<(__gnu_cxx::_Lock_policy)2>)
               ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
  stack0xfffffffffffffc38 =
       ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  __l._M_len = 3;
  __l._M_array = (iterator)&u;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(&package_123,__l,(allocator_type *)local_58);
  lVar12 = 0x30;
  do {
    p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
              (hash_if_by_txid.super_base_blob<256U>.m_data._M_elems + lVar12 + 0x18);
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    lVar12 = lVar12 + -0x10;
  } while (lVar12 != 0);
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._8_8_ =
       ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._0_8_ = ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if (ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._24_8_ =
       ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._16_8_ =
       ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  _Stack_3c0 = (__shared_count<(__gnu_cxx::_Lock_policy)2>)
               ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
  stack0xfffffffffffffc38 =
       ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&u;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(&package_132,__l_00,(allocator_type *)local_58);
  lVar12 = 0x30;
  do {
    p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
              (hash_if_by_txid.super_base_blob<256U>.m_data._M_elems + lVar12 + 0x18);
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    lVar12 = lVar12 + -0x10;
  } while (lVar12 != 0);
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._8_8_ =
       ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._0_8_ = ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if (ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._24_8_ =
       ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._16_8_ =
       ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  _Stack_3c0 = (__shared_count<(__gnu_cxx::_Lock_policy)2>)
               ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
  stack0xfffffffffffffc38 =
       ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)&u;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(&package_231,__l_01,(allocator_type *)local_58);
  lVar12 = 0x30;
  do {
    p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
              (hash_if_by_txid.super_base_blob<256U>.m_data._M_elems + lVar12 + 0x18);
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    lVar12 = lVar12 + -0x10;
  } while (lVar12 != 0);
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._8_8_ =
       ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._0_8_ = ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if (ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._24_8_ =
       ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._16_8_ =
       ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  _Stack_3c0 = (__shared_count<(__gnu_cxx::_Lock_policy)2>)
               ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
  stack0xfffffffffffffc38 =
       ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  __l_02._M_len = 3;
  __l_02._M_array = (iterator)&u;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(&package_213,__l_02,(allocator_type *)local_58);
  lVar12 = 0x30;
  do {
    p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
              (hash_if_by_txid.super_base_blob<256U>.m_data._M_elems + lVar12 + 0x18);
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    lVar12 = lVar12 + -0x10;
  } while (lVar12 != 0);
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._8_8_ =
       ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._0_8_ = ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if (ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._24_8_ =
       ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._16_8_ =
       ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  _Stack_3c0 = (__shared_count<(__gnu_cxx::_Lock_policy)2>)
               ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
  stack0xfffffffffffffc38 =
       ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  __l_03._M_len = 3;
  __l_03._M_array = (iterator)&u;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(&package_312,__l_03,(allocator_type *)local_58);
  lVar12 = 0x30;
  do {
    p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
              (hash_if_by_txid.super_base_blob<256U>.m_data._M_elems + lVar12 + 0x18);
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    lVar12 = lVar12 + -0x10;
  } while (lVar12 != 0);
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._8_8_ =
       ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._0_8_ = ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if (ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._24_8_ =
       ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._16_8_ =
       ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  _Stack_3c0 = (__shared_count<(__gnu_cxx::_Lock_policy)2>)
               ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
  stack0xfffffffffffffc38 =
       ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  __l_04._M_len = 3;
  __l_04._M_array = (iterator)&u;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(&package_321,__l_04,(allocator_type *)local_58);
  lVar12 = 0x30;
  do {
    p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
              (hash_if_by_txid.super_base_blob<256U>.m_data._M_elems + lVar12 + 0x18);
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    lVar12 = lVar12 + -0x10;
  } while (lVar12 != 0);
  stack0xfffffffffffffc38 = (undefined1  [16])0x0;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._16_16_ = (undefined1  [16])0x0;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._0_16_ = (undefined1  [16])0x0;
  CSHA256::CSHA256((CSHA256 *)&u);
  CSHA256::Write((CSHA256 *)&u,(uchar *)&local_2b8,0x20);
  CSHA256::Write((CSHA256 *)&u,(uchar *)&local_2d8,0x20);
  CSHA256::Write((CSHA256 *)&u,(uchar *)&local_2f8,0x20);
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  CSHA256::Finalize((CSHA256 *)&u,(uchar *)&calculated_hash_123);
  stack0xfffffffffffffc38 = (undefined1  [16])0x0;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._16_16_ = (undefined1  [16])0x0;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._0_16_ = (undefined1  [16])0x0;
  CSHA256::CSHA256((CSHA256 *)&u);
  CSHA256::Write((CSHA256 *)&u,(uchar *)&local_2d8,0x20);
  CSHA256::Write((CSHA256 *)&u,(uchar *)&local_2b8,0x20);
  CSHA256::Write((CSHA256 *)&u,(uchar *)&local_2f8,0x20);
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  CSHA256::Finalize((CSHA256 *)&u,(uchar *)&hash_if_by_txid);
  local_810 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_808 = "";
  local_820 = &boost::unit_test::basic_cstring<char_const>::null;
  local_818 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar49 = 0x67e444;
  file_13.m_end = &DAT_00000075;
  file_13.m_begin = (iterator)&local_810;
  msg_13.m_end = pvVar11;
  msg_13.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_820,
             msg_13);
  auVar40[0] = -(hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x10] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar40[1] = -(hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x11] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar40[2] = -(hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x12] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar40[3] = -(hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x13] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar40[4] = -(hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x14] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar40[5] = -(hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x15] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar40[6] = -(hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x16] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar40[7] = -(hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x17] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar40[8] = -(hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x18] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar40[9] = -(hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x19] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar40[10] = -(hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                 calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar40[0xb] = -(hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar40[0xc] = -(hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar40[0xd] = -(hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar40[0xe] = -(hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar40[0xf] = -(hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar22[0] = -(hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0]);
  auVar22[1] = -(hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[1] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[1]);
  auVar22[2] = -(hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[2] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[2]);
  auVar22[3] = -(hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[3] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[3]);
  auVar22[4] = -(hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[4] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[4]);
  auVar22[5] = -(hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[5] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[5]);
  auVar22[6] = -(hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[6] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[6]);
  auVar22[7] = -(hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[7] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[7]);
  auVar22[8] = -(hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[8] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[8]);
  auVar22[9] = -(hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[9] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[9]);
  auVar22[10] = -(hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[10] ==
                 calculated_hash_123.super_base_blob<256U>.m_data._M_elems[10]);
  auVar22[0xb] = -(hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0xb] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar22[0xc] = -(hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0xc] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar22[0xd] = -(hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0xd] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar22[0xe] = -(hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0xe] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar22[0xf] = -(hash_if_by_txid.super_base_blob<256U>.m_data._M_elems[0xf] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar22 = auVar22 & auVar40;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
  hash_if_use_txid.super_base_blob<256U>.m_data._M_elems._8_8_ = "";
  hash_if_use_txid.super_base_blob<256U>.m_data._M_elems._0_8_ =
       "hash_if_by_txid != calculated_hash_123";
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._M_value.super_base_blob<256U>.m_data._M_elems[8] = 0;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._0_8_ = &PTR__lazy_ostream_01389048;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._24_8_ = &hash_if_use_txid;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_830 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_828 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_58[0] = (class_property<bool>)
                (class_property<bool>)
                ((ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar22[0xf] >> 7) << 0xf) != 0xffff);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)&u,1,0,WARN,_cVar49,(size_t)&local_830,
             0x75);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  stack0xfffffffffffffc38 = (undefined1  [16])0x0;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._16_16_ = (undefined1  [16])0x0;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._0_16_ = (undefined1  [16])0x0;
  CSHA256::CSHA256((CSHA256 *)&u);
  CSHA256::Write((CSHA256 *)&u,(uchar *)&local_338,0x20);
  CSHA256::Write((CSHA256 *)&u,(uchar *)&local_318,0x20);
  CSHA256::Write((CSHA256 *)&u,(uchar *)&local_358,0x20);
  hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  CSHA256::Finalize((CSHA256 *)&u,(uchar *)&hash_if_use_txid);
  local_840 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_838 = "";
  local_850 = &boost::unit_test::basic_cstring<char_const>::null;
  local_848 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar49 = 0x67e5dc;
  file_14.m_end = (iterator)0x78;
  file_14.m_begin = (iterator)&local_840;
  msg_14.m_end = pvVar11;
  msg_14.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_850,
             msg_14);
  auVar41[0] = -(hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x10] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar41[1] = -(hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x11] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar41[2] = -(hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x12] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar41[3] = -(hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x13] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar41[4] = -(hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x14] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar41[5] = -(hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x15] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar41[6] = -(hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x16] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar41[7] = -(hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x17] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar41[8] = -(hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x18] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar41[9] = -(hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x19] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar41[10] = -(hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                 calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar41[0xb] = -(hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar41[0xc] = -(hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar41[0xd] = -(hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar41[0xe] = -(hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar41[0xf] = -(hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar23[0] = -(hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0]);
  auVar23[1] = -(hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[1] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[1]);
  auVar23[2] = -(hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[2] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[2]);
  auVar23[3] = -(hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[3] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[3]);
  auVar23[4] = -(hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[4] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[4]);
  auVar23[5] = -(hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[5] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[5]);
  auVar23[6] = -(hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[6] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[6]);
  auVar23[7] = -(hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[7] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[7]);
  auVar23[8] = -(hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[8] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[8]);
  auVar23[9] = -(hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[9] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[9]);
  auVar23[10] = -(hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[10] ==
                 calculated_hash_123.super_base_blob<256U>.m_data._M_elems[10]);
  auVar23[0xb] = -(hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0xb] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar23[0xc] = -(hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0xc] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar23[0xd] = -(hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0xd] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar23[0xe] = -(hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0xe] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar23[0xf] = -(hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0xf] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar23 = auVar23 & auVar41;
  local_58[0] = (class_property<bool>)
                ((ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar23[0xf] >> 7) << 0xf) != 0xffff);
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
  hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems._8_8_ = "";
  hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems._0_8_ =
       "hash_if_use_txid != calculated_hash_123";
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._M_value.super_base_blob<256U>.m_data._M_elems[8] = 0;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._0_8_ = &PTR__lazy_ostream_01389048;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._24_8_ = &hash_if_use_int_order;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_860 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_858 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)&u,1,0,WARN,_cVar49,(size_t)&local_860,
             0x78);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  stack0xfffffffffffffc38 = (undefined1  [16])0x0;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._16_16_ = (undefined1  [16])0x0;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._0_16_ = (undefined1  [16])0x0;
  CSHA256::CSHA256((CSHA256 *)&u);
  CSHA256::Write((CSHA256 *)&u,(uchar *)&local_2d8,0x20);
  CSHA256::Write((CSHA256 *)&u,(uchar *)&local_2b8,0x20);
  CSHA256::Write((CSHA256 *)&u,(uchar *)&local_2f8,0x20);
  hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  CSHA256::Finalize((CSHA256 *)&u,(uchar *)&hash_if_use_int_order);
  local_870 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_868 = "";
  local_880 = &boost::unit_test::basic_cstring<char_const>::null;
  local_878 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar49 = 0x67e77c;
  file_15.m_end = (iterator)0x7b;
  file_15.m_begin = (iterator)&local_870;
  msg_15.m_end = pvVar11;
  msg_15.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_880,
             msg_15);
  auVar42[0] = -(hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0x10] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar42[1] = -(hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0x11] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar42[2] = -(hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0x12] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar42[3] = -(hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0x13] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar42[4] = -(hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0x14] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar42[5] = -(hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0x15] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar42[6] = -(hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0x16] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar42[7] = -(hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0x17] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar42[8] = -(hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0x18] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar42[9] = -(hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0x19] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar42[10] = -(hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                 calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar42[0xb] = -(hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar42[0xc] = -(hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar42[0xd] = -(hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar42[0xe] = -(hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar42[0xf] = -(hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar24[0] = -(hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0]);
  auVar24[1] = -(hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[1] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[1]);
  auVar24[2] = -(hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[2] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[2]);
  auVar24[3] = -(hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[3] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[3]);
  auVar24[4] = -(hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[4] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[4]);
  auVar24[5] = -(hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[5] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[5]);
  auVar24[6] = -(hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[6] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[6]);
  auVar24[7] = -(hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[7] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[7]);
  auVar24[8] = -(hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[8] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[8]);
  auVar24[9] = -(hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[9] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[9]);
  auVar24[10] = -(hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[10] ==
                 calculated_hash_123.super_base_blob<256U>.m_data._M_elems[10]);
  auVar24[0xb] = -(hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0xb] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar24[0xc] = -(hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0xc] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar24[0xd] = -(hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0xd] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar24[0xe] = -(hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0xe] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar24[0xf] = -(hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0xf] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar24 = auVar24 & auVar42;
  local_58[0] = (class_property<bool>)
                (class_property<bool>)
                ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar24[0xf] >> 7) << 0xf) != 0xffff);
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
  local_8d0._0_8_ = "hash_if_use_int_order != calculated_hash_123";
  local_8d0._8_8_ = "";
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._M_value.super_base_blob<256U>.m_data._M_elems[8] = 0;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._0_8_ = &PTR__lazy_ostream_01389048;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._24_8_ = local_8d0;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_890 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_888 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)&u,1,0,WARN,_cVar49,(size_t)&local_890,
             0x7b);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  local_8a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_898 = "";
  local_8b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x7d;
  file_16.m_begin = (iterator)&local_8a0;
  msg_16.m_end = pvVar11;
  msg_16.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_8b0,
             msg_16);
  local_8d0._8_8_ = local_8d0._8_8_ & 0xffffffffffffff00;
  local_8d0._0_8_ = &PTR__lazy_ostream_01388f08;
  local_8c0 = boost::unit_test::lazy_ostream::inst;
  local_8b8 = "";
  GetPackageHash(&local_468,&package_123);
  auVar43[0] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x10] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar43[1] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x11] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar43[2] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x12] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar43[3] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x13] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar43[4] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x14] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar43[5] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x15] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar43[6] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x16] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar43[7] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x17] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar43[8] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x18] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar43[9] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x19] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar43[10] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                 calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar43[0xb] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar43[0xc] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar43[0xd] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar43[0xe] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar43[0xf] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar25[0] = -(local_468.super_base_blob<256U>.m_data._M_elems[0] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0]);
  auVar25[1] = -(local_468.super_base_blob<256U>.m_data._M_elems[1] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[1]);
  auVar25[2] = -(local_468.super_base_blob<256U>.m_data._M_elems[2] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[2]);
  auVar25[3] = -(local_468.super_base_blob<256U>.m_data._M_elems[3] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[3]);
  auVar25[4] = -(local_468.super_base_blob<256U>.m_data._M_elems[4] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[4]);
  auVar25[5] = -(local_468.super_base_blob<256U>.m_data._M_elems[5] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[5]);
  auVar25[6] = -(local_468.super_base_blob<256U>.m_data._M_elems[6] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[6]);
  auVar25[7] = -(local_468.super_base_blob<256U>.m_data._M_elems[7] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[7]);
  auVar25[8] = -(local_468.super_base_blob<256U>.m_data._M_elems[8] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[8]);
  auVar25[9] = -(local_468.super_base_blob<256U>.m_data._M_elems[9] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[9]);
  auVar25[10] = -(local_468.super_base_blob<256U>.m_data._M_elems[10] ==
                 calculated_hash_123.super_base_blob<256U>.m_data._M_elems[10]);
  auVar25[0xb] = -(local_468.super_base_blob<256U>.m_data._M_elems[0xb] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar25[0xc] = -(local_468.super_base_blob<256U>.m_data._M_elems[0xc] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar25[0xd] = -(local_468.super_base_blob<256U>.m_data._M_elems[0xd] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar25[0xe] = -(local_468.super_base_blob<256U>.m_data._M_elems[0xe] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar25[0xf] = -(local_468.super_base_blob<256U>.m_data._M_elems[0xf] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar25 = auVar25 & auVar43;
  local_480.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) | (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar25[0xf] >> 7) << 0xf) == 0xffff);
  local_480.m_message.px = (element_type *)0x0;
  local_480.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_488 = "";
  local_498 = &calculated_hash_123;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._M_value.super_base_blob<256U>.m_data._M_elems[8] = 0;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._0_8_ = &PTR__lazy_ostream_01389a00;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._24_8_ = &local_498;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = local_4a0;
  local_58._8_8_ = local_58._9_8_ << 8;
  local_58._0_8_ = &PTR__lazy_ostream_01389a00;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_4a0 = (undefined1  [8])&local_468;
  boost::test_tools::tt_detail::report_assertion
            (&local_480,(lazy_ostream *)local_8d0,1,2,REQUIRE,0xf43bb6,(size_t)&local_490,0x7d,
             (lazy_ostream *)&u,"GetPackageHash(package_123)",(assertion_result *)local_58);
  boost::detail::shared_count::~shared_count(&local_480.m_message.pn);
  local_8e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_8d8 = "";
  local_8f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x7e;
  file_17.m_begin = (iterator)&local_8e0;
  msg_17.m_end = pvVar11;
  msg_17.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_8f0,
             msg_17);
  local_8d0._8_8_ = local_8d0._8_8_ & 0xffffffffffffff00;
  local_8d0._0_8_ = &PTR__lazy_ostream_01388f08;
  local_8c0 = boost::unit_test::lazy_ostream::inst;
  local_8b8 = "";
  GetPackageHash(&local_468,&package_132);
  auVar44[0] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x10] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar44[1] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x11] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar44[2] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x12] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar44[3] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x13] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar44[4] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x14] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar44[5] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x15] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar44[6] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x16] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar44[7] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x17] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar44[8] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x18] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar44[9] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x19] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar44[10] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                 calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar44[0xb] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar44[0xc] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar44[0xd] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar44[0xe] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar44[0xf] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar26[0] = -(local_468.super_base_blob<256U>.m_data._M_elems[0] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0]);
  auVar26[1] = -(local_468.super_base_blob<256U>.m_data._M_elems[1] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[1]);
  auVar26[2] = -(local_468.super_base_blob<256U>.m_data._M_elems[2] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[2]);
  auVar26[3] = -(local_468.super_base_blob<256U>.m_data._M_elems[3] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[3]);
  auVar26[4] = -(local_468.super_base_blob<256U>.m_data._M_elems[4] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[4]);
  auVar26[5] = -(local_468.super_base_blob<256U>.m_data._M_elems[5] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[5]);
  auVar26[6] = -(local_468.super_base_blob<256U>.m_data._M_elems[6] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[6]);
  auVar26[7] = -(local_468.super_base_blob<256U>.m_data._M_elems[7] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[7]);
  auVar26[8] = -(local_468.super_base_blob<256U>.m_data._M_elems[8] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[8]);
  auVar26[9] = -(local_468.super_base_blob<256U>.m_data._M_elems[9] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[9]);
  auVar26[10] = -(local_468.super_base_blob<256U>.m_data._M_elems[10] ==
                 calculated_hash_123.super_base_blob<256U>.m_data._M_elems[10]);
  auVar26[0xb] = -(local_468.super_base_blob<256U>.m_data._M_elems[0xb] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar26[0xc] = -(local_468.super_base_blob<256U>.m_data._M_elems[0xc] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar26[0xd] = -(local_468.super_base_blob<256U>.m_data._M_elems[0xd] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar26[0xe] = -(local_468.super_base_blob<256U>.m_data._M_elems[0xe] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar26[0xf] = -(local_468.super_base_blob<256U>.m_data._M_elems[0xf] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar26 = auVar26 & auVar44;
  local_480.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) | (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar26[0xf] >> 7) << 0xf) == 0xffff);
  local_480.m_message.px = (element_type *)0x0;
  local_480.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_488 = "";
  local_498 = &calculated_hash_123;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._M_value.super_base_blob<256U>.m_data._M_elems[8] = 0;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._0_8_ = &PTR__lazy_ostream_01389a00;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._24_8_ = &local_498;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_58._8_8_ = local_58._9_8_ << 8;
  local_58._0_8_ = &PTR__lazy_ostream_01389a00;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = local_4a0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_4a0 = (undefined1  [8])&local_468;
  boost::test_tools::tt_detail::report_assertion
            (&local_480,(lazy_ostream *)local_8d0,1,2,REQUIRE,0xf43bb6,(size_t)&local_490,0x7e,
             (lazy_ostream *)&u,"GetPackageHash(package_132)",(assertion_result *)local_58);
  boost::detail::shared_count::~shared_count(&local_480.m_message.pn);
  local_900 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_8f8 = "";
  local_910 = &boost::unit_test::basic_cstring<char_const>::null;
  local_908 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x7f;
  file_18.m_begin = (iterator)&local_900;
  msg_18.m_end = pvVar11;
  msg_18.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_910,
             msg_18);
  local_8d0._8_8_ = local_8d0._8_8_ & 0xffffffffffffff00;
  local_8d0._0_8_ = &PTR__lazy_ostream_01388f08;
  local_8c0 = boost::unit_test::lazy_ostream::inst;
  local_8b8 = "";
  GetPackageHash(&local_468,&package_231);
  auVar45[0] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x10] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar45[1] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x11] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar45[2] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x12] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar45[3] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x13] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar45[4] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x14] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar45[5] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x15] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar45[6] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x16] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar45[7] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x17] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar45[8] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x18] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar45[9] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x19] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar45[10] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                 calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar45[0xb] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar45[0xc] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar45[0xd] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar45[0xe] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar45[0xf] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar27[0] = -(local_468.super_base_blob<256U>.m_data._M_elems[0] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0]);
  auVar27[1] = -(local_468.super_base_blob<256U>.m_data._M_elems[1] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[1]);
  auVar27[2] = -(local_468.super_base_blob<256U>.m_data._M_elems[2] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[2]);
  auVar27[3] = -(local_468.super_base_blob<256U>.m_data._M_elems[3] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[3]);
  auVar27[4] = -(local_468.super_base_blob<256U>.m_data._M_elems[4] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[4]);
  auVar27[5] = -(local_468.super_base_blob<256U>.m_data._M_elems[5] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[5]);
  auVar27[6] = -(local_468.super_base_blob<256U>.m_data._M_elems[6] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[6]);
  auVar27[7] = -(local_468.super_base_blob<256U>.m_data._M_elems[7] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[7]);
  auVar27[8] = -(local_468.super_base_blob<256U>.m_data._M_elems[8] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[8]);
  auVar27[9] = -(local_468.super_base_blob<256U>.m_data._M_elems[9] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[9]);
  auVar27[10] = -(local_468.super_base_blob<256U>.m_data._M_elems[10] ==
                 calculated_hash_123.super_base_blob<256U>.m_data._M_elems[10]);
  auVar27[0xb] = -(local_468.super_base_blob<256U>.m_data._M_elems[0xb] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar27[0xc] = -(local_468.super_base_blob<256U>.m_data._M_elems[0xc] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar27[0xd] = -(local_468.super_base_blob<256U>.m_data._M_elems[0xd] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar27[0xe] = -(local_468.super_base_blob<256U>.m_data._M_elems[0xe] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar27[0xf] = -(local_468.super_base_blob<256U>.m_data._M_elems[0xf] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar27 = auVar27 & auVar45;
  local_480.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) | (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar27[0xf] >> 7) << 0xf) == 0xffff);
  local_480.m_message.px = (element_type *)0x0;
  local_480.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_488 = "";
  local_498 = &calculated_hash_123;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._M_value.super_base_blob<256U>.m_data._M_elems[8] = 0;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._0_8_ = &PTR__lazy_ostream_01389a00;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._24_8_ = &local_498;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_58._8_8_ = local_58._9_8_ << 8;
  local_58._0_8_ = &PTR__lazy_ostream_01389a00;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = local_4a0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_4a0 = (undefined1  [8])&local_468;
  boost::test_tools::tt_detail::report_assertion
            (&local_480,(lazy_ostream *)local_8d0,1,2,REQUIRE,0xf43bb6,(size_t)&local_490,0x7f,
             (lazy_ostream *)&u,"GetPackageHash(package_231)",(assertion_result *)local_58);
  boost::detail::shared_count::~shared_count(&local_480.m_message.pn);
  local_920 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_918 = "";
  local_930 = &boost::unit_test::basic_cstring<char_const>::null;
  local_928 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x80;
  file_19.m_begin = (iterator)&local_920;
  msg_19.m_end = pvVar11;
  msg_19.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_930,
             msg_19);
  local_8d0._8_8_ = local_8d0._8_8_ & 0xffffffffffffff00;
  local_8d0._0_8_ = &PTR__lazy_ostream_01388f08;
  local_8c0 = boost::unit_test::lazy_ostream::inst;
  local_8b8 = "";
  GetPackageHash(&local_468,&package_213);
  auVar46[0] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x10] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar46[1] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x11] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar46[2] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x12] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar46[3] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x13] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar46[4] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x14] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar46[5] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x15] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar46[6] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x16] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar46[7] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x17] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar46[8] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x18] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar46[9] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x19] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar46[10] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                 calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar46[0xb] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar46[0xc] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar46[0xd] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar46[0xe] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar46[0xf] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar28[0] = -(local_468.super_base_blob<256U>.m_data._M_elems[0] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0]);
  auVar28[1] = -(local_468.super_base_blob<256U>.m_data._M_elems[1] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[1]);
  auVar28[2] = -(local_468.super_base_blob<256U>.m_data._M_elems[2] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[2]);
  auVar28[3] = -(local_468.super_base_blob<256U>.m_data._M_elems[3] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[3]);
  auVar28[4] = -(local_468.super_base_blob<256U>.m_data._M_elems[4] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[4]);
  auVar28[5] = -(local_468.super_base_blob<256U>.m_data._M_elems[5] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[5]);
  auVar28[6] = -(local_468.super_base_blob<256U>.m_data._M_elems[6] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[6]);
  auVar28[7] = -(local_468.super_base_blob<256U>.m_data._M_elems[7] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[7]);
  auVar28[8] = -(local_468.super_base_blob<256U>.m_data._M_elems[8] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[8]);
  auVar28[9] = -(local_468.super_base_blob<256U>.m_data._M_elems[9] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[9]);
  auVar28[10] = -(local_468.super_base_blob<256U>.m_data._M_elems[10] ==
                 calculated_hash_123.super_base_blob<256U>.m_data._M_elems[10]);
  auVar28[0xb] = -(local_468.super_base_blob<256U>.m_data._M_elems[0xb] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar28[0xc] = -(local_468.super_base_blob<256U>.m_data._M_elems[0xc] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar28[0xd] = -(local_468.super_base_blob<256U>.m_data._M_elems[0xd] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar28[0xe] = -(local_468.super_base_blob<256U>.m_data._M_elems[0xe] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar28[0xf] = -(local_468.super_base_blob<256U>.m_data._M_elems[0xf] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar28 = auVar28 & auVar46;
  local_480.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) | (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar28[0xf] >> 7) << 0xf) == 0xffff);
  local_480.m_message.px = (element_type *)0x0;
  local_480.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_488 = "";
  local_498 = &calculated_hash_123;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._M_value.super_base_blob<256U>.m_data._M_elems[8] = 0;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._0_8_ = &PTR__lazy_ostream_01389a00;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._24_8_ = &local_498;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_58._8_8_ = local_58._9_8_ << 8;
  local_58._0_8_ = &PTR__lazy_ostream_01389a00;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = local_4a0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_4a0 = (undefined1  [8])&local_468;
  boost::test_tools::tt_detail::report_assertion
            (&local_480,(lazy_ostream *)local_8d0,1,2,REQUIRE,0xf43bb6,(size_t)&local_490,0x80,
             (lazy_ostream *)&u,"GetPackageHash(package_213)",(assertion_result *)local_58);
  boost::detail::shared_count::~shared_count(&local_480.m_message.pn);
  local_940 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_938 = "";
  local_950 = &boost::unit_test::basic_cstring<char_const>::null;
  local_948 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x81;
  file_20.m_begin = (iterator)&local_940;
  msg_20.m_end = pvVar11;
  msg_20.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_950,
             msg_20);
  local_8d0._8_8_ = local_8d0._8_8_ & 0xffffffffffffff00;
  local_8d0._0_8_ = &PTR__lazy_ostream_01388f08;
  local_8c0 = boost::unit_test::lazy_ostream::inst;
  local_8b8 = "";
  GetPackageHash(&local_468,&package_312);
  auVar47[0] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x10] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar47[1] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x11] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar47[2] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x12] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar47[3] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x13] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar47[4] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x14] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar47[5] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x15] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar47[6] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x16] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar47[7] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x17] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar47[8] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x18] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar47[9] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x19] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar47[10] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                 calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar47[0xb] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar47[0xc] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar47[0xd] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar47[0xe] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar47[0xf] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar29[0] = -(local_468.super_base_blob<256U>.m_data._M_elems[0] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0]);
  auVar29[1] = -(local_468.super_base_blob<256U>.m_data._M_elems[1] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[1]);
  auVar29[2] = -(local_468.super_base_blob<256U>.m_data._M_elems[2] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[2]);
  auVar29[3] = -(local_468.super_base_blob<256U>.m_data._M_elems[3] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[3]);
  auVar29[4] = -(local_468.super_base_blob<256U>.m_data._M_elems[4] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[4]);
  auVar29[5] = -(local_468.super_base_blob<256U>.m_data._M_elems[5] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[5]);
  auVar29[6] = -(local_468.super_base_blob<256U>.m_data._M_elems[6] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[6]);
  auVar29[7] = -(local_468.super_base_blob<256U>.m_data._M_elems[7] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[7]);
  auVar29[8] = -(local_468.super_base_blob<256U>.m_data._M_elems[8] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[8]);
  auVar29[9] = -(local_468.super_base_blob<256U>.m_data._M_elems[9] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[9]);
  auVar29[10] = -(local_468.super_base_blob<256U>.m_data._M_elems[10] ==
                 calculated_hash_123.super_base_blob<256U>.m_data._M_elems[10]);
  auVar29[0xb] = -(local_468.super_base_blob<256U>.m_data._M_elems[0xb] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar29[0xc] = -(local_468.super_base_blob<256U>.m_data._M_elems[0xc] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar29[0xd] = -(local_468.super_base_blob<256U>.m_data._M_elems[0xd] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar29[0xe] = -(local_468.super_base_blob<256U>.m_data._M_elems[0xe] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar29[0xf] = -(local_468.super_base_blob<256U>.m_data._M_elems[0xf] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar29 = auVar29 & auVar47;
  local_480.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) | (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar29[0xf] >> 7) << 0xf) == 0xffff);
  local_480.m_message.px = (element_type *)0x0;
  local_480.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_488 = "";
  local_498 = &calculated_hash_123;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._M_value.super_base_blob<256U>.m_data._M_elems[8] = 0;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._0_8_ = &PTR__lazy_ostream_01389a00;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._24_8_ = &local_498;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_58._8_8_ = local_58._9_8_ << 8;
  local_58._0_8_ = &PTR__lazy_ostream_01389a00;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = local_4a0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_4a0 = (undefined1  [8])&local_468;
  boost::test_tools::tt_detail::report_assertion
            (&local_480,(lazy_ostream *)local_8d0,1,2,REQUIRE,0xf43bb6,(size_t)&local_490,0x81,
             (lazy_ostream *)&u,"GetPackageHash(package_312)",(assertion_result *)local_58);
  boost::detail::shared_count::~shared_count(&local_480.m_message.pn);
  local_960 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_958 = "";
  local_970 = &boost::unit_test::basic_cstring<char_const>::null;
  local_968 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x82;
  file_21.m_begin = (iterator)&local_960;
  msg_21.m_end = pvVar11;
  msg_21.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_970,
             msg_21);
  local_8d0._8_8_ = local_8d0._8_8_ & 0xffffffffffffff00;
  local_8d0._0_8_ = &PTR__lazy_ostream_01388f08;
  local_8c0 = boost::unit_test::lazy_ostream::inst;
  local_8b8 = "";
  GetPackageHash(&local_468,&package_321);
  auVar48[0] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x10] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar48[1] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x11] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar48[2] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x12] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar48[3] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x13] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar48[4] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x14] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar48[5] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x15] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar48[6] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x16] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar48[7] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x17] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar48[8] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x18] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar48[9] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x19] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar48[10] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                 calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar48[0xb] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar48[0xc] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar48[0xd] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar48[0xe] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar48[0xf] = -(local_468.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar30[0] = -(local_468.super_base_blob<256U>.m_data._M_elems[0] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0]);
  auVar30[1] = -(local_468.super_base_blob<256U>.m_data._M_elems[1] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[1]);
  auVar30[2] = -(local_468.super_base_blob<256U>.m_data._M_elems[2] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[2]);
  auVar30[3] = -(local_468.super_base_blob<256U>.m_data._M_elems[3] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[3]);
  auVar30[4] = -(local_468.super_base_blob<256U>.m_data._M_elems[4] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[4]);
  auVar30[5] = -(local_468.super_base_blob<256U>.m_data._M_elems[5] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[5]);
  auVar30[6] = -(local_468.super_base_blob<256U>.m_data._M_elems[6] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[6]);
  auVar30[7] = -(local_468.super_base_blob<256U>.m_data._M_elems[7] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[7]);
  auVar30[8] = -(local_468.super_base_blob<256U>.m_data._M_elems[8] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[8]);
  auVar30[9] = -(local_468.super_base_blob<256U>.m_data._M_elems[9] ==
                calculated_hash_123.super_base_blob<256U>.m_data._M_elems[9]);
  auVar30[10] = -(local_468.super_base_blob<256U>.m_data._M_elems[10] ==
                 calculated_hash_123.super_base_blob<256U>.m_data._M_elems[10]);
  auVar30[0xb] = -(local_468.super_base_blob<256U>.m_data._M_elems[0xb] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar30[0xc] = -(local_468.super_base_blob<256U>.m_data._M_elems[0xc] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar30[0xd] = -(local_468.super_base_blob<256U>.m_data._M_elems[0xd] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar30[0xe] = -(local_468.super_base_blob<256U>.m_data._M_elems[0xe] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar30[0xf] = -(local_468.super_base_blob<256U>.m_data._M_elems[0xf] ==
                  calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar30 = auVar30 & auVar48;
  local_480.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) | (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar30[0xf] >> 7) << 0xf) == 0xffff);
  local_480.m_message.px = (element_type *)0x0;
  local_480.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_488 = "";
  local_498 = &calculated_hash_123;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._M_value.super_base_blob<256U>.m_data._M_elems[8] = 0;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._0_8_ = &PTR__lazy_ostream_01389a00;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._24_8_ = &local_498;
  u.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
  _M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_58._8_8_ = local_58._9_8_ << 8;
  local_58._0_8_ = &PTR__lazy_ostream_01389a00;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = local_4a0;
  local_4a0 = (undefined1  [8])&local_468;
  boost::test_tools::tt_detail::report_assertion
            (&local_480,(lazy_ostream *)local_8d0,1,2,REQUIRE,0xf43bb6,(size_t)&local_490,0x82,
             (lazy_ostream *)&u,"GetPackageHash(package_321)",(assertion_result *)local_58);
  boost::detail::shared_count::~shared_count(&local_480.m_message.pn);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&package_321);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&package_312);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&package_213);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&package_231);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&package_132);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&package_123);
  if (ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&tx_3.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&tx_3.vin);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&stream_3);
  if (ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&tx_2.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&tx_2.vin);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&stream_2);
  if (ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&tx_1.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&tx_1.vin);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&stream_1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0067f8a0:
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(package_hash_tests)
{
    // Random real segwit transaction
    DataStream stream_1{
        "02000000000101964b8aa63509579ca6086e6012eeaa4c2f4dd1e283da29b67c8eea38b3c6fd220000000000fdffffff0294c618000000000017a9145afbbb42f4e83312666d0697f9e66259912ecde38768fa2c0000000000160014897388a0889390fd0e153a22bb2cf9d8f019faf50247304402200547406380719f84d68cf4e96cc3e4a1688309ef475b150be2b471c70ea562aa02206d255f5acc40fd95981874d77201d2eb07883657ce1c796513f32b6079545cdf0121023ae77335cefcb5ab4c1dc1fb0d2acfece184e593727d7d5906c78e564c7c11d125cf0c00"_hex,
    };
    CTransaction tx_1(deserialize, TX_WITH_WITNESS, stream_1);
    CTransactionRef ptx_1{MakeTransactionRef(tx_1)};

    // Random real nonsegwit transaction
    DataStream stream_2{
        "01000000010b26e9b7735eb6aabdf358bab62f9816a21ba9ebdb719d5299e88607d722c190000000008b4830450220070aca44506c5cef3a16ed519d7c3c39f8aab192c4e1c90d065f37b8a4af6141022100a8e160b856c2d43d27d8fba71e5aef6405b8643ac4cb7cb3c462aced7f14711a0141046d11fee51b0e60666d5049a9101a72741df480b96ee26488a4d3466b95c9a40ac5eeef87e10a5cd336c19a84565f80fa6c547957b7700ff4dfbdefe76036c339ffffffff021bff3d11000000001976a91404943fdd508053c75000106d3bc6e2754dbcff1988ac2f15de00000000001976a914a266436d2965547608b9e15d9032a7b9d64fa43188ac00000000"_hex,
    };
    CTransaction tx_2(deserialize, TX_WITH_WITNESS, stream_2);
    CTransactionRef ptx_2{MakeTransactionRef(tx_2)};

    // Random real segwit transaction
    DataStream stream_3{
        "0200000000010177862801f77c2c068a70372b4c435ef8dd621291c36a64eb4dd491f02218f5324600000000fdffffff014a0100000000000022512035ea312034cfac01e956a269f3bf147f569c2fbb00180677421262da042290d803402be713325ff285e66b0380f53f2fae0d0fb4e16f378a440fed51ce835061437566729d4883bc917632f3cff474d6384bc8b989961a1d730d4a87ed38ad28bd337b20f1d658c6c138b1c312e072b4446f50f01ae0da03a42e6274f8788aae53416a7fac0063036f7264010118746578742f706c61696e3b636861727365743d7574662d3800357b2270223a226272632d3230222c226f70223a226d696e74222c227469636b223a224342414c222c22616d74223a2236393639227d6821c1f1d658c6c138b1c312e072b4446f50f01ae0da03a42e6274f8788aae53416a7f00000000"_hex,
    };
    CTransaction tx_3(deserialize, TX_WITH_WITNESS, stream_3);
    CTransactionRef ptx_3{MakeTransactionRef(tx_3)};

    // It's easy to see that wtxids are sorted in lexicographical order:
    Wtxid wtxid_1{Wtxid::FromHex("85cd1a31eb38f74ed5742ec9cb546712ab5aaf747de28a9168b53e846cbda17f").value()};
    Wtxid wtxid_2{Wtxid::FromHex("b4749f017444b051c44dfd2720e88f314ff94f3dd6d56d40ef65854fcd7fff6b").value()};
    Wtxid wtxid_3{Wtxid::FromHex("e065bac15f62bb4e761d761db928ddee65a47296b2b776785abb912cdec474e3").value()};
    BOOST_CHECK_EQUAL(tx_1.GetWitnessHash(), wtxid_1);
    BOOST_CHECK_EQUAL(tx_2.GetWitnessHash(), wtxid_2);
    BOOST_CHECK_EQUAL(tx_3.GetWitnessHash(), wtxid_3);

    BOOST_CHECK(wtxid_1.GetHex() < wtxid_2.GetHex());
    BOOST_CHECK(wtxid_2.GetHex() < wtxid_3.GetHex());

    // The txids are not (we want to test that sorting and hashing use wtxid, not txid):
    Txid txid_1{Txid::FromHex("bd0f71c1d5e50589063e134fad22053cdae5ab2320db5bf5e540198b0b5a4e69").value()};
    Txid txid_2{Txid::FromHex("b4749f017444b051c44dfd2720e88f314ff94f3dd6d56d40ef65854fcd7fff6b").value()};
    Txid txid_3{Txid::FromHex("ee707be5201160e32c4fc715bec227d1aeea5940fb4295605e7373edce3b1a93").value()};
    BOOST_CHECK_EQUAL(tx_1.GetHash(), txid_1);
    BOOST_CHECK_EQUAL(tx_2.GetHash(), txid_2);
    BOOST_CHECK_EQUAL(tx_3.GetHash(), txid_3);

    BOOST_CHECK(txid_2.GetHex() < txid_1.GetHex());

    BOOST_CHECK(txid_1.ToUint256() != wtxid_1.ToUint256());
    BOOST_CHECK(txid_2.ToUint256() == wtxid_2.ToUint256());
    BOOST_CHECK(txid_3.ToUint256() != wtxid_3.ToUint256());

    // We are testing that both functions compare using GetHex() and not uint256.
    // (in this pair of wtxids, hex string order != uint256 order)
    BOOST_CHECK(wtxid_2 < wtxid_1);
    // (in this pair of wtxids, hex string order == uint256 order)
    BOOST_CHECK(wtxid_2 < wtxid_3);

    // All permutations of the package containing ptx_1, ptx_2, ptx_3 have the same package hash
    std::vector<CTransactionRef> package_123{ptx_1, ptx_2, ptx_3};
    std::vector<CTransactionRef> package_132{ptx_1, ptx_3, ptx_2};
    std::vector<CTransactionRef> package_231{ptx_2, ptx_3, ptx_1};
    std::vector<CTransactionRef> package_213{ptx_2, ptx_1, ptx_3};
    std::vector<CTransactionRef> package_312{ptx_3, ptx_1, ptx_2};
    std::vector<CTransactionRef> package_321{ptx_3, ptx_2, ptx_1};

    uint256 calculated_hash_123 = (HashWriter() << wtxid_1 << wtxid_2 << wtxid_3).GetSHA256();

    uint256 hash_if_by_txid = (HashWriter() << wtxid_2 << wtxid_1 << wtxid_3).GetSHA256();
    BOOST_CHECK(hash_if_by_txid != calculated_hash_123);

    uint256 hash_if_use_txid = (HashWriter() << txid_2 << txid_1 << txid_3).GetSHA256();
    BOOST_CHECK(hash_if_use_txid != calculated_hash_123);

    uint256 hash_if_use_int_order = (HashWriter() << wtxid_2 << wtxid_1 << wtxid_3).GetSHA256();
    BOOST_CHECK(hash_if_use_int_order != calculated_hash_123);

    BOOST_CHECK_EQUAL(calculated_hash_123, GetPackageHash(package_123));
    BOOST_CHECK_EQUAL(calculated_hash_123, GetPackageHash(package_132));
    BOOST_CHECK_EQUAL(calculated_hash_123, GetPackageHash(package_231));
    BOOST_CHECK_EQUAL(calculated_hash_123, GetPackageHash(package_213));
    BOOST_CHECK_EQUAL(calculated_hash_123, GetPackageHash(package_312));
    BOOST_CHECK_EQUAL(calculated_hash_123, GetPackageHash(package_321));
}